

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

void target_machinize(gen_ctx_t gen_ctx)

{
  undefined1 *puVar1;
  char cVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  ushort uVar5;
  target_ctx *ptVar6;
  VARR_MIR_var_t *pVVar7;
  MIR_var_t *pMVar8;
  ulong *puVar9;
  void *pvVar10;
  MIR_disp_t MVar11;
  MIR_disp_t MVar12;
  void *pvVar13;
  long *plVar14;
  MIR_insn_t pMVar15;
  int iVar16;
  MIR_reg_t MVar17;
  uint uVar18;
  uint uVar19;
  MIR_reg_t MVar20;
  MIR_func_t pMVar21;
  size_t sVar22;
  MIR_item_t_conflict pMVar23;
  MIR_insn_t_conflict pMVar24;
  MIR_error_func_t p_Var25;
  MIR_insn_t pMVar26;
  size_t *psVar27;
  MIR_item_t_conflict pMVar28;
  ulong uVar29;
  undefined2 uVar30;
  MIR_type_t MVar31;
  MIR_insn_code_t MVar32;
  MIR_insn_t_conflict pMVar33;
  MIR_op_t *pMVar34;
  int64_t i;
  uint uVar35;
  MIR_type_t MVar36;
  long lVar37;
  int iVar38;
  MIR_op_t *pMVar39;
  char *pcVar40;
  MIR_error_type_t MVar41;
  MIR_context_t pMVar42;
  MIR_reg_t base;
  int iVar43;
  int iVar44;
  MIR_insn_t pMVar45;
  long lVar46;
  byte bVar47;
  int iVar48;
  MIR_type_t arg_type;
  ulong uVar49;
  anon_union_32_12_57d33f68_for_u *paVar50;
  int64_t i_00;
  undefined1 *puVar51;
  bool bVar52;
  MIR_insn_t pMVar53;
  MIR_insn_t pMVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  MIR_insn_code_t new_insn_code;
  MIR_insn_code_t mov_code2;
  MIR_op_t temp_op;
  MIR_insn_code_t new_insn_code_1;
  size_t fp_arg_num;
  size_t int_arg_num;
  size_t fp_arg_num_1;
  size_t int_arg_num_1;
  MIR_op_t temp_op_1;
  MIR_op_t mem_op_1;
  MIR_op_t reg_op3;
  MIR_insn_code_t mov_code1;
  MIR_item_t func_import_item_1;
  MIR_op_t dest_reg_op;
  MIR_item_t proto_item_1;
  MIR_insn_code_t mov_code2_2;
  MIR_op_t ret_reg_op;
  MIR_item_t func_import_item;
  MIR_item_t proto_item;
  MIR_op_t mem_op;
  MIR_op_t arg_reg_op;
  MIR_insn_t in_stack_fffffffffffff0e8;
  undefined4 uVar57;
  undefined8 in_stack_fffffffffffff0f8;
  undefined8 in_stack_fffffffffffff108;
  long local_e70;
  MIR_insn_code_t local_e4c;
  size_t local_e48;
  long local_e40;
  MIR_context_t local_e38;
  ulong local_e30;
  uint local_e24;
  size_t local_e20;
  MIR_insn_t local_e18;
  MIR_insn_t pMStack_e10;
  MIR_insn_t pMStack_e08;
  char *pcStack_e00;
  void *local_df8;
  MIR_insn_t local_df0;
  void *pvStack_de8;
  MIR_insn_t pMStack_de0;
  MIR_insn_t local_dd8;
  MIR_disp_t MStack_dd0;
  void *pvStack_dc8;
  MIR_insn_t pMStack_dc0;
  MIR_op_t *local_db0;
  MIR_insn_code_t local_da4;
  MIR_insn_t local_da0;
  MIR_insn_t_conflict local_d98;
  size_t local_d90;
  size_t local_d88;
  size_t local_d80;
  size_t local_d78;
  long local_d70;
  MIR_item_t_conflict local_d68;
  MIR_func_t local_d60;
  MIR_insn_t local_d58;
  MIR_insn_t pMStack_d50;
  MIR_insn_t pMStack_d48;
  undefined6 uStack_d40;
  undefined2 uStack_d3a;
  undefined6 uStack_d38;
  undefined2 uStack_d32;
  MIR_insn_t pMStack_d30;
  MIR_func_t local_d28;
  ulong local_d20;
  MIR_insn_t pMStack_d18;
  MIR_insn_t pMStack_d10;
  MIR_insn_t local_d08;
  undefined6 uStack_d00;
  undefined2 uStack_cfa;
  undefined6 uStack_cf8;
  undefined2 uStack_cf2;
  MIR_insn_t pMStack_cf0;
  MIR_insn_t local_ce8;
  undefined8 uStack_ce0;
  byte bStack_cd8;
  undefined7 uStack_cd7;
  undefined1 uStack_cd0;
  undefined7 uStack_ccf;
  undefined1 uStack_cc8;
  undefined7 uStack_cc7;
  MIR_insn_t pMStack_cc0;
  undefined1 local_cb8 [16];
  anon_union_32_12_57d33f68_for_u aStack_ca8;
  MIR_insn_t local_c88;
  MIR_insn_t pMStack_c80;
  MIR_insn_t pMStack_c78;
  char *pcStack_c70;
  void *pvStack_c68;
  MIR_insn_t pMStack_c60;
  MIR_insn_t local_c58;
  undefined2 local_c50;
  undefined6 uStack_c4e;
  undefined2 local_c48;
  undefined6 uStack_c46;
  undefined2 uStack_c40;
  undefined6 uStack_c3e;
  undefined2 uStack_c38;
  undefined6 uStack_c36;
  undefined2 uStack_c30;
  undefined6 uStack_c2e;
  MIR_insn_t local_c28;
  undefined1 local_c20 [8];
  MIR_insn_t local_c18;
  char *pcStack_c10;
  void *pvStack_c08;
  MIR_insn_t pMStack_c00;
  MIR_insn_t local_bf8;
  undefined8 local_bf0;
  byte local_be8;
  undefined7 uStack_be7;
  undefined1 uStack_be0;
  undefined7 uStack_bdf;
  undefined1 uStack_bd8;
  undefined7 uStack_bd7;
  MIR_insn_t pMStack_bd0;
  MIR_insn_t pMStack_bc8;
  undefined8 uStack_bc0;
  void *local_bb8;
  undefined8 uStack_bb0;
  int64_t iStack_ba8;
  char *pcStack_ba0;
  ulong local_b98;
  long *local_b90;
  undefined1 local_b88 [16];
  anon_union_32_12_57d33f68_for_u aStack_b78;
  ulong local_b50;
  MIR_op_t local_b48;
  MIR_insn_t local_b18;
  MIR_insn_t pMStack_b10;
  MIR_insn_t pMStack_b08;
  char *pcStack_b00;
  void *pvStack_af8;
  MIR_insn_t pMStack_af0;
  undefined4 local_ae8;
  undefined2 uStack_ae4;
  MIR_insn_t local_ab8;
  long lStack_ab0;
  MIR_insn_t pMStack_aa8;
  undefined6 uStack_aa0;
  undefined2 uStack_a9a;
  undefined6 uStack_a98;
  undefined2 uStack_a92;
  MIR_insn_code_t local_a88;
  undefined4 uStack_a84;
  MIR_insn_t pMStack_a80;
  MIR_insn_t pMStack_a78;
  char *pcStack_a70;
  void *pvStack_a68;
  MIR_insn_t pMStack_a60;
  MIR_insn_t pMStack_a58;
  MIR_insn_t pMStack_a50;
  MIR_insn_t local_a48;
  char *pcStack_a40;
  void *pvStack_a38;
  MIR_insn_t pMStack_a30;
  MIR_op_t local_a28;
  MIR_insn_t local_9f8 [2];
  MIR_insn_t pMStack_9e8;
  void *pvStack_9d8;
  MIR_insn_t pMStack_9c8;
  MIR_insn_t pMStack_9c0;
  MIR_insn_t local_9b8;
  char *pcStack_9b0;
  void *pvStack_9a8;
  MIR_insn_t pMStack_9a0;
  MIR_insn_t pMStack_998;
  MIR_insn_t pMStack_990;
  MIR_insn_t local_988;
  char *pcStack_980;
  void *pvStack_978;
  MIR_insn_t pMStack_970;
  MIR_op_t local_908 [3];
  MIR_op_t local_878 [4];
  MIR_op_t local_7b8 [2];
  MIR_op_t local_758 [2];
  MIR_insn_t local_6f8;
  MIR_insn_t pMStack_6e8;
  void *pvStack_6d8;
  MIR_insn_t local_6c8;
  MIR_insn_t pMStack_6b8;
  void *pvStack_6a8;
  MIR_insn_t local_638;
  MIR_insn_t pMStack_628;
  void *pvStack_618;
  MIR_insn_t local_5d8;
  MIR_insn_t pMStack_5c8;
  void *pvStack_5b8;
  MIR_op_t local_578 [2];
  MIR_op_t local_518 [2];
  MIR_insn_t local_4b8;
  MIR_insn_t pMStack_4a8;
  void *pvStack_498;
  MIR_op_t local_458 [2];
  MIR_op_t local_3f8 [3];
  MIR_insn_t local_368;
  MIR_insn_t pMStack_358;
  void *pvStack_348;
  undefined8 local_1e8;
  undefined4 uStack_1e4;
  MIR_insn_t pMStack_1d8;
  void *pvStack_1c8;
  MIR_op_t local_c8;
  MIR_insn_t local_98;
  MIR_insn_t pMStack_88;
  void *pvStack_78;
  MIR_op_t local_68;
  
  pMVar42 = gen_ctx->ctx;
  local_d88 = 0;
  local_d90 = 0;
  if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
    __assert_fail("curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x2ba,"void target_machinize(gen_ctx_t)");
  }
  local_d60 = (gen_ctx->curr_func_item->u).func;
  ptVar6 = gen_ctx->target_ctx;
  ptVar6->block_arg_func_p = '\0';
  ptVar6->start_sp_from_bp_offset = 8;
  ptVar6->keep_fp_p = local_d60->vararg_p;
  local_e38 = pMVar42;
  if (local_d60->nargs != 0) {
    pMVar33 = (MIR_insn_t_conflict)&DAT_00000010;
    uVar49 = 0;
    local_e70 = 0;
    do {
      pVVar7 = local_d60->vars;
      if (((pVVar7 == (VARR_MIR_var_t *)0x0) || (pMVar8 = pVVar7->varr, pMVar8 == (MIR_var_t *)0x0))
         || (pVVar7->els_num <= uVar49)) {
        target_machinize_cold_1();
LAB_0015add7:
        __assert_fail("blk_size <= 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x2ce,"void target_machinize(gen_ctx_t)");
      }
      MVar31 = *(MIR_type_t *)((long)&pMVar8[-1].name + (long)pMVar33);
      if (MVar31 - MIR_T_RBLK < 0xfffffffb) {
        uVar29 = 0;
      }
      else {
        uVar29 = *(long *)((long)&pMVar33->ops[0].data + (long)&pMVar8[-2].size) + 7U &
                 0xfffffffffffffff8;
      }
      iVar48 = (int)uVar49;
      local_d98 = pMVar33;
      if ((((MVar31 == (MIR_T_BLK|MIR_T_U8)) && (local_d88 < 6)) &&
          ((uVar29 < 9 || (local_d88 + 1 < 6)))) ||
         (((MVar31 == (MIR_T_BLK|MIR_T_I16) && ((int)local_d90 != -0x11 && local_d90 < 8)) &&
          (uVar29 < 9 || local_d90 < 7)))) {
        MVar31 = (uint)(MVar31 != (MIR_T_BLK|MIR_T_U8)) * 3 + MIR_T_I64;
        MVar17 = get_arg_reg(MVar31,&local_d88,&local_d90,(MIR_insn_code_t *)local_cb8);
        if (0x10 < uVar29) goto LAB_0015add7;
        if (8 < uVar29) {
          MVar20 = get_arg_reg(MVar31,&local_d88,&local_d90,(MIR_insn_code_t *)&local_e18);
          pMVar42 = local_e38;
          uVar57 = local_cb8._0_4_;
          _MIR_new_var_mem_op(local_3f8,local_e38,MVar31,8,iVar48 + 0x22,0xffffffff,'\x01');
          _MIR_new_var_op(pMVar42,MVar20);
          pMVar33 = MIR_new_insn(pMVar42,uVar57);
          MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
          create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar33->insn_link).next,(MIR_insn_t)0x0);
        }
        pMVar42 = local_e38;
        uVar57 = local_cb8._0_4_;
        _MIR_new_var_mem_op(local_458,local_e38,MVar31,0,iVar48 + 0x22U,0xffffffff,'\x01');
        _MIR_new_var_op(pMVar42,MVar17);
        pMVar33 = MIR_new_insn(pMVar42,uVar57);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar33->insn_link).next,(MIR_insn_t)0x0);
        _MIR_new_var_op(pMVar42,iVar48 + 0x22U);
        MIR_new_int_op(pMVar42,uVar29);
        in_stack_fffffffffffff0e8 = local_4b8;
        in_stack_fffffffffffff0f8 = pMStack_4a8;
        in_stack_fffffffffffff108 = pvStack_498;
        pMVar33 = MIR_new_insn(pMVar42,MIR_ALLOCA);
        goto LAB_0015750b;
      }
      if (((MVar31 - (MIR_T_BLK|MIR_T_U16) < 2) && (local_d88 < 6)) &&
         ((int)local_d90 != -0x11 && local_d90 < 8)) {
        MVar36 = (uint)(MVar31 != (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
        MVar31 = (uint)(MVar31 == (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
        MVar17 = get_arg_reg(MVar36,&local_d88,&local_d90,(MIR_insn_code_t *)local_cb8);
        MVar20 = get_arg_reg(MVar31,&local_d88,&local_d90,(MIR_insn_code_t *)&local_e18);
        pMVar42 = local_e38;
        if (uVar29 != 0x10) goto LAB_0015adfb;
        MVar32 = (MIR_insn_code_t)local_e18;
        base = iVar48 + 0x22;
        _MIR_new_var_mem_op(local_518,local_e38,MVar31,8,base,0xffffffff,'\x01');
        _MIR_new_var_op(pMVar42,MVar20);
        pMVar33 = MIR_new_insn(pMVar42,MVar32);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar33->insn_link).next,(MIR_insn_t)0x0);
        uVar57 = local_cb8._0_4_;
        _MIR_new_var_mem_op(local_578,pMVar42,MVar36,0,base,0xffffffff,'\x01');
        _MIR_new_var_op(pMVar42,MVar17);
        pMVar33 = MIR_new_insn(pMVar42,uVar57);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar33->insn_link).next,(MIR_insn_t)0x0);
        _MIR_new_var_op(pMVar42,base);
        MIR_new_int_op(pMVar42,0x10);
        in_stack_fffffffffffff0e8 = local_5d8;
        in_stack_fffffffffffff0f8 = pMStack_5c8;
        in_stack_fffffffffffff108 = pvStack_5b8;
        pMVar33 = MIR_new_insn(pMVar42,MIR_ALLOCA);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
        pMVar26 = (pMVar33->insn_link).next;
LAB_00157521:
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,pMVar26,(MIR_insn_t)0x0);
      }
      else {
        if (0xfffffffa < MVar31 - MIR_T_RBLK) {
          ptVar6 = gen_ctx->target_ctx;
          ptVar6->block_arg_func_p = '\x01';
          ptVar6->keep_fp_p = '\x01';
          _MIR_new_var_op(pMVar42,iVar48 + 0x22);
          _MIR_new_var_op(pMVar42,5);
          MIR_new_int_op(pMVar42,local_e70 + 8 + (long)gen_ctx->target_ctx->start_sp_from_bp_offset)
          ;
          in_stack_fffffffffffff0e8 = local_638;
          in_stack_fffffffffffff0f8 = pMStack_628;
          in_stack_fffffffffffff108 = pvStack_618;
          pMVar33 = MIR_new_insn(pMVar42,MIR_ADD);
          local_e70 = local_e70 + uVar29;
LAB_0015750b:
          MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
          pMVar26 = (pMVar33->insn_link).next;
          goto LAB_00157521;
        }
        MVar17 = get_arg_reg(MVar31,&local_d88,&local_d90,&local_e4c);
        if (MVar17 != 0xffffffff) {
          _MIR_new_var_op(pMVar42,MVar17);
          MVar32 = local_e4c;
          pvStack_978 = (void *)aStack_ca8._16_8_;
          pMStack_970 = (MIR_insn_t)aStack_ca8.mem.disp;
          pMStack_998 = (MIR_insn_t)local_cb8._0_8_;
          pMStack_990 = (MIR_insn_t)local_cb8._8_8_;
          local_988 = (MIR_insn_t)aStack_ca8.i;
          pcStack_980 = aStack_ca8.str.s;
          _MIR_new_var_op(pMVar42,iVar48 + 0x22);
          in_stack_fffffffffffff0e8 = local_6c8;
          in_stack_fffffffffffff0f8 = pMStack_6b8;
          in_stack_fffffffffffff108 = pvStack_6a8;
          pMVar33 = MIR_new_insn(pMVar42,MVar32);
          goto LAB_0015750b;
        }
        ptVar6 = gen_ctx->target_ctx;
        ptVar6->block_arg_func_p = '\x01';
        ptVar6->keep_fp_p = '\x01';
        MVar36 = MIR_T_I64;
        if ((MVar31 & ~MIR_T_U8) == MIR_T_F) {
          MVar36 = MVar31;
        }
        if (MVar31 == MIR_T_LD) {
          MVar36 = MVar31;
        }
        if (MVar31 == MIR_T_F) {
          MVar32 = MIR_FMOV;
        }
        else if (MVar31 == MIR_T_D) {
          MVar32 = MIR_DMOV;
        }
        else {
          MVar32 = (uint)(MVar31 == MIR_T_LD) * 3;
        }
        local_e4c = MVar32;
        _MIR_new_var_mem_op((MIR_op_t *)local_cb8,pMVar42,MVar36,
                            local_e70 + 8 + (long)ptVar6->start_sp_from_bp_offset,5,0xffffffff,
                            '\x01');
        pvStack_9a8 = (void *)aStack_ca8._16_8_;
        pMStack_9a0 = (MIR_insn_t)aStack_ca8.mem.disp;
        pMStack_9c8 = (MIR_insn_t)local_cb8._0_8_;
        pMStack_9c0 = (MIR_insn_t)local_cb8._8_8_;
        local_9b8 = (MIR_insn_t)aStack_ca8.i;
        pcStack_9b0 = aStack_ca8.str.s;
        _MIR_new_var_op(pMVar42,iVar48 + 0x22);
        in_stack_fffffffffffff0e8 = local_6f8;
        in_stack_fffffffffffff0f8 = pMStack_6e8;
        in_stack_fffffffffffff108 = pvStack_6d8;
        pMVar33 = MIR_new_insn(pMVar42,MVar32);
        MIR_prepend_insn(gen_ctx->ctx,gen_ctx->curr_func_item,pMVar33);
        create_new_bb_insns(gen_ctx,(MIR_insn_t)0x0,(pMVar33->insn_link).next,(MIR_insn_t)0x0);
        local_e70 = local_e70 + 8 + (ulong)(MVar31 == MIR_T_LD) * 8;
      }
      uVar49 = uVar49 + 1;
      pMVar33 = (MIR_insn_t_conflict)&local_d98->field_0x18;
    } while (uVar49 < local_d60->nargs);
  }
  ptVar6 = gen_ctx->target_ctx;
  ptVar6->alloca_p = '\0';
  ptVar6->leaf_p = '\x01';
  pMVar26 = (local_d60->insns).head;
  if (pMVar26 != (MIR_insn_t)0x0) {
    local_b90 = (long *)(local_c20 + 2);
    do {
      local_d98 = (pMVar26->insn_link).next;
      MVar32 = *(MIR_insn_code_t *)&pMVar26->field_0x18;
      switch(MVar32) {
      case MIR_UI2F:
      case MIR_UI2D:
      case MIR_UI2LD:
      case MIR_LD2I:
        pMVar53 = (MIR_insn_t)pMVar26->ops[0].data;
        uVar4 = *(undefined2 *)&pMVar26->ops[0].field_0x8;
        uStack_d38 = (undefined6)((ulong)pMVar26->ops[0].u.mem.disp >> 0x10);
        local_d58 = *(MIR_insn_t *)&pMVar26->ops[0].field_0xa;
        pMStack_d50 = *(MIR_insn_t *)((long)&pMVar26->ops[0].u.str.len + 2);
        pMStack_d48 = *(MIR_insn_t *)((long)&pMVar26->ops[0].u.str.s + 2);
        uVar55 = *(undefined8 *)((long)&pMVar26->ops[0].u + 0x12);
        uStack_d40 = (undefined6)uVar55;
        uStack_d3a = (undefined2)((ulong)uVar55 >> 0x30);
        pMVar54 = (MIR_insn_t)pMVar26[1].data;
        uVar5 = *(ushort *)&pMVar26[1].insn_link.prev;
        uStack_cf8 = (undefined6)((ulong)*(undefined8 *)&pMVar26[1].ops[0].field_0x8 >> 0x10);
        pMStack_d18 = *(MIR_insn_t *)((long)&pMVar26[1].insn_link.prev + 2);
        pMStack_d10 = *(MIR_insn_t *)((long)&pMVar26[1].insn_link.next + 2);
        local_d08 = *(MIR_insn_t *)&pMVar26[1].field_0x1a;
        uVar55 = *(undefined8 *)((long)&pMVar26[1].ops[0].data + 2);
        uStack_d00 = (undefined6)uVar55;
        uStack_cfa = (undefined2)((ulong)uVar55 >> 0x30);
        get_builtin(gen_ctx,MVar32,(MIR_item_t_conflict *)&local_ab8,
                    (MIR_item_t_conflict *)&local_b48);
        if (((char)uVar4 != '\x02') || ((uVar5 & 0xff) != 2)) goto LAB_0015ae81;
        MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
        pMVar42 = local_e38;
        uVar19 = MVar17 + 0x21;
        if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
          gen_ctx->curr_cfg->max_var = uVar19;
        }
        _MIR_new_var_op(local_e38,uVar19);
        pMStack_e08 = (MIR_insn_t)CONCAT71(uStack_cd7,bStack_cd8);
        pcStack_e00 = (char *)CONCAT71(uStack_ccf,uStack_cd0);
        local_df8 = (void *)CONCAT71(uStack_cc7,uStack_cc8);
        local_df0 = pMStack_cc0;
        local_e18 = local_ce8;
        pMStack_e10 = uStack_ce0;
        MIR_new_ref_op(pMVar42,(MIR_item_t_conflict)local_b48.data);
        in_stack_fffffffffffff0e8 = local_e18;
        in_stack_fffffffffffff0f8 = pMStack_e08;
        in_stack_fffffffffffff108 = local_df8;
        local_d98 = MIR_new_insn(pMVar42,MIR_MOV);
        gen_add_insn_before(gen_ctx,pMVar26,local_d98);
        MIR_new_ref_op(pMVar42,(MIR_item_t_conflict)local_ab8);
        plVar14 = local_b90;
        aStack_ca8.i = CONCAT71(uStack_cd7,bStack_cd8);
        aStack_ca8.str.s = (char *)CONCAT71(uStack_ccf,uStack_cd0);
        aStack_ca8._16_8_ = CONCAT71(uStack_cc7,uStack_cc8);
        aStack_ca8.mem.disp = (MIR_disp_t)pMStack_cc0;
        local_cb8._0_8_ = local_ce8;
        local_cb8._8_8_ = uStack_ce0;
        pvStack_c68 = local_df8;
        pMStack_c60 = local_df0;
        local_c88 = local_e18;
        pMStack_c80 = pMStack_e10;
        pMStack_c78 = pMStack_e08;
        pcStack_c70 = pcStack_e00;
        uStack_c2e = uStack_d38;
        uStack_c4e = SUB86(local_d58,0);
        local_c48 = (undefined2)((ulong)local_d58 >> 0x30);
        uStack_c46 = SUB86(pMStack_d50,0);
        uStack_c40 = (undefined2)((ulong)pMStack_d50 >> 0x30);
        uStack_c3e = SUB86(pMStack_d48,0);
        uStack_c38 = (undefined2)((ulong)pMStack_d48 >> 0x30);
        uStack_c36 = uStack_d40;
        uStack_c30 = uStack_d3a;
        local_c20._0_2_ = uVar5;
        *(ulong *)((long)local_b90 + 0x1e) = CONCAT62(uStack_cf8,uStack_cfa);
        *plVar14 = (long)pMStack_d18;
        plVar14[1] = (long)pMStack_d10;
        plVar14[2] = (long)local_d08;
        plVar14[3] = CONCAT26(uStack_cfa,uStack_d00);
        local_c58 = pMVar53;
        local_c50 = uVar4;
        local_c28 = pMVar54;
        pMVar33 = MIR_new_insn_arr(pMVar42,MIR_CALL,4,(MIR_op_t *)local_cb8);
        gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
LAB_00158376:
        gen_delete_insn(gen_ctx,pMVar26);
        goto LAB_00157f49;
      case MIR_F2I:
      case MIR_D2I:
      case MIR_F2D:
      case MIR_F2LD:
      case MIR_D2F:
      case MIR_D2LD:
      case MIR_LD2F:
      case MIR_LD2D:
      case MIR_NEG:
      case MIR_NEGS:
      case MIR_FNEG:
      case MIR_DNEG:
      case MIR_LDNEG:
      case MIR_ADDR:
      case MIR_ADDR8:
      case MIR_ADDR16:
      case MIR_ADDR32:
      case MIR_ADD:
      case MIR_ADDS:
      case MIR_FADD:
      case MIR_DADD:
      case MIR_LDADD:
      case MIR_SUB:
      case MIR_SUBS:
      case MIR_FSUB:
      case MIR_DSUB:
      case MIR_LDSUB:
      case MIR_MUL:
      case MIR_MULS:
      case MIR_FMUL:
      case MIR_DMUL:
      case MIR_LDMUL:
      case MIR_FDIV:
      case MIR_DDIV:
      case MIR_LDDIV:
      case MIR_AND:
      case MIR_ANDS:
      case MIR_OR:
      case MIR_ORS:
      case MIR_XOR:
      case MIR_XORS:
      case MIR_LDEQ:
      case MIR_LDNE:
      case MIR_LDGT:
      case MIR_LDGE:
      case MIR_ADDO:
      case MIR_ADDOS:
      case MIR_SUBO:
      case MIR_SUBOS:
      case MIR_MULO:
      case MIR_MULOS:
      case MIR_JMP:
      case MIR_BT:
      case MIR_BTS:
      case MIR_BF:
      case MIR_BFS:
      case MIR_BEQ:
      case MIR_BEQS:
      case MIR_FBEQ:
      case MIR_DBEQ:
      case MIR_LDBEQ:
      case MIR_BNE:
      case MIR_BNES:
      case MIR_FBNE:
      case MIR_DBNE:
      case MIR_LDBNE:
      case MIR_BLT:
      case MIR_BLTS:
      case MIR_UBLT:
      case MIR_UBLTS:
      case MIR_BLE:
      case MIR_BLES:
      case MIR_UBLE:
      case MIR_UBLES:
switchD_0015799d_caseD_10:
        if (0xfffffffc < MVar32 - MIR_SWITCH) {
          pMVar42 = gen_ctx->ctx;
          local_d28 = (gen_ctx->curr_func_item->u).func;
          lVar46 = *(long *)((long)&(pMVar26->ops[0].u.label)->ops[0].u + 0x10);
          sVar22 = MIR_insn_nops(pMVar42,pMVar26);
          iVar48 = *(int *)(lVar46 + 8);
          local_d78 = 0;
          local_d80 = 0;
          pMVar53 = (pMVar26->insn_link).prev;
          local_d70 = lVar46;
          if (pMVar53 == (MIR_insn_t)0x0) {
            __assert_fail("prev_call_insn != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0xc0,"void machinize_call(gen_ctx_t, MIR_insn_t)");
          }
          if ((int)*(ulong *)&pMVar26->field_0x18 == 0xa8) {
            *(ulong *)&pMVar26->field_0x18 =
                 *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0xa7;
          }
          uVar49 = (ulong)(iVar48 + 2);
          puVar9 = *(ulong **)(lVar46 + 0x20);
          local_da0 = pMVar53;
          if (puVar9 == (ulong *)0x0) {
            local_b98 = 0;
            local_d20 = 0;
          }
          else {
            local_d20 = *puVar9;
            if ((sVar22 < local_d20) ||
               ((*(char *)(lVar46 + 0x18) == '\0' && (sVar22 - uVar49 != local_d20)))) {
              __assert_fail("nops >= (VARR_MIR_var_tlength (proto->args)) && (proto->vararg_p || nops - start == (VARR_MIR_var_tlength (proto->args)))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0xc6,"void machinize_call(gen_ctx_t, MIR_insn_t)");
            }
            local_b98 = puVar9[2];
          }
          cVar2 = *(char *)&pMVar26[1].insn_link.prev;
          local_e30 = uVar49;
          if ((cVar2 != '\x02') && (cVar2 != '\b')) {
            MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d28);
            uVar19 = MVar17 + 0x21;
            if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
              gen_ctx->curr_cfg->max_var = uVar19;
            }
            _MIR_new_var_op(pMVar42,uVar19);
            uStack_d38 = (undefined6)aStack_ca8._16_8_;
            uStack_d32 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
            pMStack_d30 = (MIR_insn_t)aStack_ca8.mem.disp;
            local_d58 = (MIR_insn_t)local_cb8._0_8_;
            pMStack_d50 = (MIR_insn_t)local_cb8._8_8_;
            pMStack_d48 = (MIR_insn_t)aStack_ca8.i;
            uStack_d40 = SUB86(aStack_ca8.str.s,0);
            uStack_d3a = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
            in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
            in_stack_fffffffffffff0f8 = aStack_ca8.i;
            in_stack_fffffffffffff108 = aStack_ca8._16_8_;
            pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
            pMVar26[1].data = local_d58;
            pMVar26[1].insn_link.prev = pMStack_d50;
            pMVar26[1].insn_link.next = pMStack_d48;
            *(ulong *)&pMVar26[1].field_0x18 = CONCAT26(uStack_d3a,uStack_d40);
            pMVar26[1].insn_link.next = pMStack_d48;
            *(ulong *)&pMVar26[1].field_0x18 = CONCAT26(uStack_d3a,uStack_d40);
            pMVar26[1].ops[0].data = (void *)CONCAT26(uStack_d32,uStack_d38);
            *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMStack_d30;
            gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          }
          if (local_e30 < sVar22) {
            pMVar34 = pMVar26->ops;
            uVar49 = 0;
            local_e40 = 0;
            uVar29 = local_e30;
            local_e20 = sVar22;
            local_db0 = pMVar34;
            do {
              local_e18 = (MIR_insn_t)pMVar34[uVar29].data;
              pMStack_e10 = *(MIR_insn_t *)&pMVar34[uVar29].field_0x8;
              paVar50 = &pMVar34[uVar29].u;
              pMStack_e08 = (MIR_insn_t)paVar50->u;
              pcStack_e00 = (char *)(&paVar50->i)[1];
              local_df8 = (void *)(&paVar50->u)[2];
              local_df0 = (MIR_insn_t)(&paVar50->ref)[3];
              if (((char)pMStack_e10 != '\x02') &&
                 (((char)pMStack_e10 != '\v' || ((byte)pMStack_e08 - 0x12 < 0xfffffffa)))) {
                __assert_fail("arg_op.mode == MIR_OP_VAR || (arg_op.mode == MIR_OP_VAR_MEM && MIR_all_blk_type_p (arg_op.u.var_mem.type))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0xd6,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              pMVar39 = pMVar34 + uVar29;
              if (uVar29 - local_e30 < local_d20) {
                pMVar23 = (MIR_item_t_conflict)
                          (ulong)*(uint *)(local_b98 + (uVar29 - local_e30) * 0x18);
              }
              else if (((ushort)pMStack_e10 & 0xff) == 0xb) {
                pMVar23 = (MIR_item_t_conflict)((ulong)pMStack_e08 & 0xff);
                if ((byte)pMStack_e08 - 0x12 < 0xfffffffa) {
                  __assert_fail("MIR_all_blk_type_p (type)",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xdb,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
              }
              else {
                uVar5 = *(ushort *)&pMVar39->field_0x8 >> 8;
                if (4 < (ushort)(uVar5 - 3)) {
                  __assert_fail("mode == MIR_OP_INT || mode == MIR_OP_UINT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xdf,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                pMVar23 = (MIR_item_t_conflict)0x9;
                if (uVar5 != 6) {
                  if (uVar5 == 5) {
                    p_Var25 = MIR_get_error_func(pMVar42);
                    pcVar40 = "passing float variadic arg (should be passed as double)";
                    MVar41 = MIR_call_op_error;
                    goto LAB_0015ae7d;
                  }
                  pMVar23 = (MIR_item_t_conflict)
                            (ulong)((uint)(*(ushort *)&pMVar39->field_0x8 >> 8 == 7) * 4 + 6);
                }
              }
              local_e24 = CONCAT31(local_e24._1_3_,uVar49 < 8);
              MVar31 = (MIR_type_t)pMVar23;
              switch(pMVar23) {
              case (MIR_item_t_conflict)0x0:
                MVar32 = MIR_EXT8;
                break;
              case (MIR_item_t_conflict)0x1:
                MVar32 = MIR_UEXT8;
                break;
              case (MIR_item_t_conflict)0x2:
                MVar32 = MIR_EXT16;
                break;
              case (MIR_item_t_conflict)0x3:
                MVar32 = MIR_UEXT16;
                break;
              case (MIR_item_t_conflict)0x4:
                MVar32 = MIR_EXT32;
                break;
              case (MIR_item_t_conflict)0x5:
                MVar32 = MIR_UEXT32;
                break;
              default:
                MVar32 = MIR_INVALID_INSN;
                bVar52 = true;
                goto LAB_00159474;
              }
              bVar52 = false;
LAB_00159474:
              local_e48 = uVar29;
              if (bVar52) {
                pMVar33 = (MIR_insn_t)0x0;
              }
              else {
                MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d28);
                uVar19 = MVar17 + 0x21;
                if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
                  gen_ctx->curr_cfg->max_var = uVar19;
                }
                _MIR_new_var_op(pMVar42,uVar19);
                uStack_d38 = (undefined6)aStack_ca8._16_8_;
                uStack_d32 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                pMStack_d30 = (MIR_insn_t)aStack_ca8.mem.disp;
                local_d58 = (MIR_insn_t)local_cb8._0_8_;
                pMStack_d50 = (MIR_insn_t)local_cb8._8_8_;
                pMStack_d48 = (MIR_insn_t)aStack_ca8.i;
                uStack_d40 = SUB86(aStack_ca8.str.s,0);
                uStack_d3a = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                in_stack_fffffffffffff0f8 = aStack_ca8.i;
                in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                pMVar33 = MIR_new_insn(pMVar42,MVar32);
                pcStack_e00 = (char *)CONCAT26(uStack_d3a,uStack_d40);
                local_df8 = (void *)CONCAT26(uStack_d32,uStack_d38);
                local_e18 = local_d58;
                pMStack_e10 = pMStack_d50;
                pMStack_e08 = pMStack_d48;
                local_df0 = pMStack_d30;
                (pMVar39->u).i = (int64_t)pMStack_d48;
                (pMVar39->u).str.s = pcStack_e00;
                *(void **)((long)&pMVar39->u + 0x10) = local_df8;
                (pMVar39->u).mem.disp = (MIR_disp_t)pMStack_d30;
                pMVar39->data = local_d58;
                *(MIR_insn_t *)&pMVar39->field_0x8 = pMStack_d50;
                (pMVar39->u).i = (int64_t)pMStack_d48;
                (pMVar39->u).str.s = (char *)CONCAT26(uStack_d3a,uStack_d40);
                pMVar34 = local_db0;
              }
              if (MVar31 - MIR_T_RBLK < 0xfffffffb) {
                uVar29 = 0;
              }
              else {
                if ((char)pMStack_e10 != '\v') {
                  __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xee,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                puVar1 = (undefined1 *)((long)&local_df0->data + 7);
                puVar51 = (undefined1 *)((long)&(local_df0->insn_link).prev + 6);
                if (-1 < (long)puVar1) {
                  puVar51 = puVar1;
                }
                uVar29 = (ulong)puVar51 & 0xfffffffffffffff8;
              }
              local_b50 = uVar49;
              if ((((MVar31 == (MIR_T_BLK|MIR_T_U8)) && (local_d78 < 6)) &&
                  ((uVar29 < 9 || (local_d78 + 1 < 6)))) ||
                 (((MVar31 == (MIR_T_BLK|MIR_T_I16) && ((int)local_d80 != -0x11 && local_d80 < 8))
                  && (uVar29 < 9 || local_d80 < 7)))) {
                MVar36 = (uint)(MVar31 != (MIR_T_BLK|MIR_T_U8)) * 3 + MIR_T_I64;
                MVar17 = get_arg_reg(MVar36,&local_d78,&local_d80,(MIR_insn_code_t *)local_cb8);
                if (0x10 < uVar29) {
                  __assert_fail("size <= 16",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0xfc,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                uVar57 = local_cb8._0_4_;
                _MIR_new_var_op(pMVar42,MVar17);
                _MIR_new_var_mem_op(&local_b48,pMVar42,MVar36,0,(MIR_reg_t)local_df8,0xffffffff,
                                    '\x01');
                in_stack_fffffffffffff108 = CONCAT26(uStack_a92,uStack_a98);
                in_stack_fffffffffffff0e8 = local_ab8;
                in_stack_fffffffffffff0f8 = pMStack_aa8;
                pMVar33 = MIR_new_insn(pMVar42,uVar57);
                gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
                setup_call_hard_reg_args(gen_ctx,pMVar26,MVar17);
                (pMVar39->u).mem.base = 0xffffffff;
                pMVar34 = local_db0;
                if (8 < uVar29) {
                  MVar17 = get_arg_reg(MVar36,&local_d78,&local_d80,(MIR_insn_code_t *)local_cb8);
                  uVar57 = local_cb8._0_4_;
                  _MIR_new_var_op(pMVar42,MVar17);
                  _MIR_new_var_mem_op(&local_a28,pMVar42,MVar36,8,(MIR_reg_t)local_df8,0xffffffff,
                                      '\x01');
                  in_stack_fffffffffffff0e8 = local_9f8[0];
                  in_stack_fffffffffffff0f8 = pMStack_9e8;
                  in_stack_fffffffffffff108 = pvStack_9d8;
                  pMVar33 = MIR_new_insn(pMVar42,uVar57);
                  gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
                  setup_call_hard_reg_args(gen_ctx,pMVar26,MVar17);
                  pMVar34 = local_db0;
                }
              }
              else if (((MVar31 - (MIR_T_BLK|MIR_T_U16) < 2) && (local_d78 < 6)) &&
                      ((int)local_d80 != -0x11 && local_d80 < 8)) {
                MVar36 = (uint)(MVar31 != (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
                arg_type = (uint)(MVar31 == (MIR_T_BLK|MIR_T_U16)) * 3 + MIR_T_I64;
                MVar17 = get_arg_reg(MVar36,&local_d78,&local_d80,(MIR_insn_code_t *)local_cb8);
                local_d68 = (MIR_item_t_conflict)CONCAT44(local_d68._4_4_,arg_type);
                MVar20 = get_arg_reg(arg_type,&local_d78,&local_d80,&local_a88);
                if (uVar29 != 0x10) {
                  __assert_fail("size > 8 && size <= 16",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0x116,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                }
                uVar57 = local_cb8._0_4_;
                _MIR_new_var_op(pMVar42,MVar17);
                _MIR_new_var_mem_op(&local_68,pMVar42,MVar36,0,(MIR_reg_t)local_df8,0xffffffff,
                                    '\x01');
                pMVar33 = MIR_new_insn(pMVar42,uVar57);
                setup_call_hard_reg_args(gen_ctx,pMVar26,MVar17);
                (pMVar39->u).mem.base = 0xffffffff;
                gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
                MVar32 = local_a88;
                _MIR_new_var_op(pMVar42,MVar20);
                _MIR_new_var_mem_op(&local_c8,pMVar42,(MIR_type_t)local_d68,8,(MIR_reg_t)local_df8,
                                    0xffffffff,'\x01');
                in_stack_fffffffffffff0e8 = local_98;
                in_stack_fffffffffffff0f8 = pMStack_88;
                in_stack_fffffffffffff108 = pvStack_78;
                pMVar33 = MIR_new_insn(pMVar42,MVar32);
                gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
                setup_call_hard_reg_args(gen_ctx,pMVar26,MVar20);
                pMVar34 = local_db0;
              }
              else if (MVar31 - MIR_T_RBLK < 0xfffffffb) {
                MVar17 = get_arg_reg(MVar31,&local_d78,&local_d80,&local_da4);
                if (MVar17 == 0xffffffff) {
                  if (MVar31 == MIR_T_RBLK) {
                    if ((char)pMStack_e10 != '\v') {
                      __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                    ,0x1b1,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                    }
                    _MIR_new_var_op(pMVar42,(MIR_reg_t)local_df8);
                    local_df8 = (void *)aStack_ca8._16_8_;
                    local_df0 = (MIR_insn_t)aStack_ca8.mem.disp;
                    local_e18 = (MIR_insn_t)local_cb8._0_8_;
                    pMStack_e10 = (MIR_insn_t)local_cb8._8_8_;
                    pMStack_e08 = (MIR_insn_t)aStack_ca8.i;
                    pcStack_e00 = aStack_ca8.str.s;
                  }
                  lVar46 = local_e40;
                  pMVar28 = (MIR_item_t_conflict)0x6;
                  if ((MVar31 & ~MIR_T_U8) == MIR_T_F) {
                    pMVar28 = pMVar23;
                  }
                  MVar36 = (MIR_type_t)pMVar28;
                  if (MVar31 == MIR_T_LD) {
                    MVar36 = MIR_T_LD;
                  }
                  if (MVar31 == MIR_T_F) {
                    MVar32 = MIR_FMOV;
                  }
                  else if (MVar31 == MIR_T_D) {
                    MVar32 = MIR_DMOV;
                  }
                  else {
                    MVar32 = (uint)(MVar31 == MIR_T_LD) * 3;
                  }
                  local_da4 = MVar32;
                  _MIR_new_var_mem_op((MIR_op_t *)local_cb8,pMVar42,MVar36,local_e40,4,0xffffffff,
                                      '\x01');
                  uStack_cf8 = (undefined6)aStack_ca8._16_8_;
                  uStack_cf2 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                  pMStack_cf0 = (MIR_insn_t)aStack_ca8.mem.disp;
                  pMStack_d18 = (MIR_insn_t)local_cb8._0_8_;
                  pMStack_d10 = (MIR_insn_t)local_cb8._8_8_;
                  local_d08 = (MIR_insn_t)aStack_ca8.i;
                  uStack_d00 = SUB86(aStack_ca8.str.s,0);
                  uStack_cfa = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                  in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                  in_stack_fffffffffffff0f8 = aStack_ca8.i;
                  in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                  pMVar24 = MIR_new_insn(pMVar42,MVar32);
                  pMVar53 = local_da0;
                  MIR_insert_insn_after(pMVar42,gen_ctx->curr_func_item,local_da0,pMVar24);
                  create_new_bb_insns(gen_ctx,(pMVar24->insn_link).prev,(pMVar24->insn_link).next,
                                      pMVar26);
                  (pMVar39->u).i = (int64_t)local_d08;
                  (pMVar39->u).str.s = (char *)CONCAT26(uStack_cfa,uStack_d00);
                  *(ulong *)((long)&pMVar39->u + 0x10) = CONCAT26(uStack_cf2,uStack_cf8);
                  (pMVar39->u).mem.disp = (MIR_disp_t)pMStack_cf0;
                  pMVar39->data = pMStack_d18;
                  *(MIR_insn_t *)&pMVar39->field_0x8 = pMStack_d10;
                  (pMVar39->u).i = (int64_t)local_d08;
                  (pMVar39->u).str.s = (char *)CONCAT26(uStack_cfa,uStack_d00);
                  local_e40 = lVar46 + 8 + (ulong)(MVar31 == MIR_T_LD) * 8;
                  pMVar34 = local_db0;
                  if (pMVar33 != (MIR_insn_t)0x0) {
                    gen_add_insn_after(gen_ctx,pMVar53,pMVar33);
                    pMVar34 = local_db0;
                  }
                }
                else {
                  if (pMVar33 != (MIR_insn_t)0x0) {
                    gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
                  }
                  MVar32 = local_da4;
                  if (MVar31 == MIR_T_RBLK) {
                    if ((char)pMStack_e10 != '\v') {
                      __assert_fail("arg_op.mode == MIR_OP_VAR_MEM",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                    ,0x198,"void machinize_call(gen_ctx_t, MIR_insn_t)");
                    }
                    _MIR_new_var_op(pMVar42,MVar17);
                    _MIR_new_var_op(pMVar42,(MIR_reg_t)local_df8);
                    in_stack_fffffffffffff0f8 = pMStack_1d8;
                    in_stack_fffffffffffff108 = pvStack_1c8;
                    uVar57 = uStack_1e4;
                    pMVar33 = MIR_new_insn(pMVar42,MVar32);
                    in_stack_fffffffffffff0e8 = (MIR_insn_t)CONCAT44(uVar57,1);
                    _MIR_new_var_mem_op((MIR_op_t *)local_cb8,pMVar42,MIR_T_RBLK,
                                        (MIR_disp_t)local_df0,MVar17,0xffffffff,'\x01');
                    uStack_cc8 = (undefined1)aStack_ca8._16_8_;
                    uStack_cc7 = (undefined7)((ulong)aStack_ca8._16_8_ >> 8);
                    pMStack_cc0 = (MIR_insn_t)aStack_ca8.mem.disp;
                    local_ce8 = (MIR_insn_t)local_cb8._0_8_;
                    uStack_ce0 = (MIR_insn_t)local_cb8._8_8_;
                    bStack_cd8 = (byte)aStack_ca8.i;
                    uStack_cd7 = (undefined7)((ulong)aStack_ca8._0_8_ >> 8);
                    uStack_cd0 = SUB81(aStack_ca8.str.s,0);
                    uStack_ccf = (undefined7)((ulong)aStack_ca8._8_8_ >> 8);
                  }
                  else {
                    _MIR_new_var_op(pMVar42,MVar17);
                    uStack_cc8 = (undefined1)aStack_ca8._16_8_;
                    uStack_cc7 = (undefined7)((ulong)aStack_ca8._16_8_ >> 8);
                    pMStack_cc0 = (MIR_insn_t)aStack_ca8.mem.disp;
                    local_ce8 = (MIR_insn_t)local_cb8._0_8_;
                    uStack_ce0 = (MIR_insn_t)local_cb8._8_8_;
                    bStack_cd8 = (byte)aStack_ca8.i;
                    uStack_cd7 = (undefined7)((ulong)aStack_ca8._0_8_ >> 8);
                    uStack_cd0 = SUB81(aStack_ca8.str.s,0);
                    uStack_ccf = (undefined7)((ulong)aStack_ca8._8_8_ >> 8);
                    in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                    in_stack_fffffffffffff0f8 = aStack_ca8.i;
                    in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                    pMVar33 = MIR_new_insn(pMVar42,local_da4);
                  }
                  gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
                  (pMVar39->u).i = CONCAT71(uStack_cd7,bStack_cd8);
                  (pMVar39->u).str.s = (char *)CONCAT71(uStack_ccf,uStack_cd0);
                  *(ulong *)((long)&pMVar39->u + 0x10) = CONCAT71(uStack_cc7,uStack_cc8);
                  (pMVar39->u).mem.disp = (MIR_disp_t)pMStack_cc0;
                  pMVar39->data = local_ce8;
                  *(MIR_insn_t *)&pMVar39->field_0x8 = uStack_ce0;
                  (pMVar39->u).i = CONCAT71(uStack_cd7,bStack_cd8);
                  (pMVar39->u).str.s = (char *)CONCAT71(uStack_ccf,uStack_cd0);
                }
              }
              else if (uVar29 - 1 < 0x10) {
                local_d68 = pMVar23;
                MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d28);
                uVar19 = MVar17 + 0x21;
                if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
                  gen_ctx->curr_cfg->max_var = uVar19;
                }
                _MIR_new_var_op(pMVar42,uVar19);
                uStack_d38 = (undefined6)aStack_ca8._16_8_;
                uStack_d32 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                pMStack_d30 = (MIR_insn_t)aStack_ca8.mem.disp;
                local_d58 = (MIR_insn_t)local_cb8._0_8_;
                pMStack_d50 = (MIR_insn_t)local_cb8._8_8_;
                pMStack_d48 = (MIR_insn_t)aStack_ca8.i;
                uStack_d40 = SUB86(aStack_ca8.str.s,0);
                uStack_d3a = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                if (uVar29 != 0) {
                  bVar52 = false;
                  uVar49 = 0;
                  do {
                    lVar46 = local_e40 + uVar49;
                    _MIR_new_var_mem_op((MIR_op_t *)local_cb8,pMVar42,MIR_T_I64,uVar49,
                                        (MIR_reg_t)local_df8,0xffffffff,'\x01');
                    uStack_cf8 = (undefined6)aStack_ca8._16_8_;
                    uStack_cf2 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                    pMStack_cf0 = (MIR_insn_t)aStack_ca8.mem.disp;
                    pMStack_d18 = (MIR_insn_t)local_cb8._0_8_;
                    pMStack_d10 = (MIR_insn_t)local_cb8._8_8_;
                    local_d08 = (MIR_insn_t)aStack_ca8.i;
                    uStack_d00 = SUB86(aStack_ca8.str.s,0);
                    uStack_cfa = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                    pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
                    gen_add_insn_after(gen_ctx,local_da0,pMVar33);
                    _MIR_new_var_mem_op((MIR_op_t *)local_cb8,pMVar42,MIR_T_I64,lVar46,4,0xffffffff,
                                        '\x01');
                    uStack_cf8 = (undefined6)aStack_ca8._16_8_;
                    uStack_cf2 = (undefined2)((ulong)aStack_ca8._16_8_ >> 0x30);
                    pMStack_cf0 = (MIR_insn_t)aStack_ca8.mem.disp;
                    pMStack_d18 = (MIR_insn_t)local_cb8._0_8_;
                    pMStack_d10 = (MIR_insn_t)local_cb8._8_8_;
                    local_d08 = (MIR_insn_t)aStack_ca8.i;
                    uStack_d00 = SUB86(aStack_ca8.str.s,0);
                    uStack_cfa = (undefined2)((ulong)aStack_ca8._8_8_ >> 0x30);
                    in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                    in_stack_fffffffffffff0f8 = aStack_ca8.i;
                    in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                    pMVar24 = MIR_new_insn(pMVar42,MIR_MOV);
                    gen_add_insn_after(gen_ctx,pMVar33,pMVar24);
                    if (!bVar52) {
                      in_stack_fffffffffffff0e8 =
                           (MIR_insn_t)CONCAT44((int)((ulong)in_stack_fffffffffffff0e8 >> 0x20),1);
                      _MIR_new_var_mem_op((MIR_op_t *)local_cb8,pMVar42,(MIR_type_t)local_d68,lVar46
                                          ,4,0xffffffff,'\x01');
                      (pMVar39->u).i = aStack_ca8.i;
                      *(char **)((long)&pMVar39->u + 8) = aStack_ca8.str.s;
                      *(undefined8 *)((long)&pMVar39->u + 0x10) = aStack_ca8._16_8_;
                      (pMVar39->u).mem.disp = aStack_ca8.mem.disp;
                      pMVar39->data = (void *)local_cb8._0_8_;
                      *(undefined8 *)&pMVar39->field_0x8 = local_cb8._8_8_;
                      (pMVar39->u).i = aStack_ca8.i;
                      *(char **)((long)&pMVar39->u + 8) = aStack_ca8.str.s;
                    }
                    uVar49 = uVar49 + 8;
                    bVar52 = true;
                  } while (uVar29 != uVar49);
                  pMVar34 = local_db0;
                  local_e40 = local_e40 + uVar49;
                }
              }
              else {
                pMVar23 = _MIR_builtin_proto(pMVar42,gen_ctx->curr_func_item->module,
                                             "mir.arg_memcpy.p",0,(MIR_type_t *)0x0,3,
                                             CONCAT44((int)((ulong)in_stack_fffffffffffff0e8 >> 0x20
                                                           ),6),"dest",
                                             CONCAT44((int)((ulong)in_stack_fffffffffffff0f8 >> 0x20
                                                           ),6),"src",
                                             CONCAT44((int)((ulong)in_stack_fffffffffffff108 >> 0x20
                                                           ),6),"n");
                local_d68 = _MIR_builtin_func(pMVar42,gen_ctx->curr_func_item->module,
                                              "mir.arg_memcpy",memcpy);
                MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func)
                ;
                uVar19 = MVar17 + 0x21;
                if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
                  gen_ctx->curr_cfg->max_var = uVar19;
                }
                _MIR_new_var_op(pMVar42,uVar19);
                MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func)
                ;
                uVar19 = MVar17 + 0x21;
                if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
                  gen_ctx->curr_cfg->max_var = uVar19;
                }
                _MIR_new_var_op(pMVar42,uVar19);
                pvStack_af8 = (void *)aStack_b78._16_8_;
                pMStack_af0 = (MIR_insn_t)aStack_b78.mem.disp;
                local_b18 = (MIR_insn_t)local_b88._0_8_;
                pMStack_b10 = (MIR_insn_t)local_b88._8_8_;
                pMStack_b08 = (MIR_insn_t)aStack_b78.i;
                pcStack_b00 = aStack_b78.str.s;
                MIR_new_ref_op(pMVar42,pMVar23);
                aStack_ca8._16_8_ = aStack_b78._16_8_;
                aStack_ca8.mem.disp = aStack_b78.mem.disp;
                local_cb8._0_8_ = local_b88._0_8_;
                local_cb8._8_8_ = local_b88._8_8_;
                aStack_ca8.i = aStack_b78.i;
                aStack_ca8.str.s = aStack_b78.str.s;
                local_c88 = (MIR_insn_t)CONCAT44(uStack_a84,local_a88);
                pvStack_c68 = pvStack_a68;
                pMStack_c60 = pMStack_a60;
                pMStack_c80 = pMStack_a80;
                pMStack_c78 = pMStack_a78;
                pcStack_c70 = pcStack_a70;
                _MIR_new_var_op(pMVar42,7);
                uStack_c38 = (undefined2)aStack_b78._16_8_;
                uStack_c36 = (undefined6)((ulong)aStack_b78._16_8_ >> 0x10);
                uStack_c30 = (undefined2)aStack_b78.mem.disp;
                uStack_c2e = (undefined6)((ulong)aStack_b78._24_8_ >> 0x10);
                local_c58 = (MIR_insn_t)local_b88._0_8_;
                local_c50 = (undefined2)local_b88._8_8_;
                uStack_c4e = SUB86(local_b88._8_8_,2);
                local_c48 = (undefined2)aStack_b78.i;
                uStack_c46 = (undefined6)((ulong)aStack_b78._0_8_ >> 0x10);
                uStack_c40 = SUB82(aStack_b78.str.s,0);
                uStack_c3e = (undefined6)((ulong)aStack_b78._8_8_ >> 0x10);
                _MIR_new_var_op(pMVar42,6);
                pvStack_c08 = (void *)aStack_b78._16_8_;
                pMStack_c00 = (MIR_insn_t)aStack_b78.mem.disp;
                local_c28 = (MIR_insn_t)local_b88._0_8_;
                local_c20 = (undefined1  [8])local_b88._8_8_;
                local_c18 = (MIR_insn_t)aStack_b78.i;
                pcStack_c10 = aStack_b78.str.s;
                _MIR_new_var_op(pMVar42,2);
                uStack_bd8 = (undefined1)aStack_b78._16_8_;
                uStack_bd7 = (undefined7)((ulong)aStack_b78._16_8_ >> 8);
                pMStack_bd0 = (MIR_insn_t)aStack_b78.mem.disp;
                local_bf8 = (MIR_insn_t)local_b88._0_8_;
                local_bf0 = (MIR_insn_t)local_b88._8_8_;
                local_be8 = (byte)aStack_b78.i;
                uStack_be7 = (undefined7)((ulong)aStack_b78._0_8_ >> 8);
                uStack_be0 = SUB81(aStack_b78.str.s,0);
                uStack_bdf = (undefined7)((ulong)aStack_b78._8_8_ >> 8);
                pMVar33 = MIR_new_insn_arr(pMVar42,MIR_CALL,5,(MIR_op_t *)local_cb8);
                pMVar53 = local_da0;
                gen_add_insn_after(gen_ctx,local_da0,pMVar33);
                MIR_new_int_op(pMVar42,uVar29);
                pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar53,pMVar33);
                _MIR_new_var_op(pMVar42,(MIR_reg_t)local_df8);
                pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar53,pMVar33);
                pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
                gen_add_insn_after(gen_ctx,pMVar53,pMVar33);
                lVar46 = local_e40;
                lVar37 = uVar29 + local_e40;
                _MIR_new_var_op(pMVar42,4);
                MIR_new_int_op(pMVar42,lVar46);
                pMVar33 = MIR_new_insn(pMVar42,MIR_ADD);
                gen_add_insn_after(gen_ctx,pMVar53,pMVar33);
                MIR_new_ref_op(pMVar42,local_d68);
                pMVar54 = local_c88;
                in_stack_fffffffffffff0f8 = pMStack_c78;
                in_stack_fffffffffffff108 = pvStack_c68;
                pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
                uVar57 = (undefined4)((ulong)pMVar54 >> 0x20);
                gen_add_insn_after(gen_ctx,pMVar53,pMVar33);
                in_stack_fffffffffffff0e8 = (MIR_insn_t)CONCAT44(uVar57,1);
                _MIR_new_var_mem_op((MIR_op_t *)local_b88,pMVar42,MIR_T_BLK,(MIR_disp_t)local_df0,
                                    uVar19,0xffffffff,'\x01');
                (pMVar39->u).i = aStack_b78.i;
                (pMVar39->u).str.s = aStack_b78.str.s;
                *(undefined8 *)((long)&pMVar39->u + 0x10) = aStack_b78._16_8_;
                (pMVar39->u).mem.disp = aStack_b78.mem.disp;
                pMVar39->data = (void *)local_b88._0_8_;
                *(undefined8 *)&pMVar39->field_0x8 = local_b88._8_8_;
                (pMVar39->u).i = aStack_b78.i;
                (pMVar39->u).str.s = aStack_b78.str.s;
                pMVar34 = local_db0;
                local_e40 = lVar37;
              }
              uVar49 = local_b50 + ((byte)local_e24 & (MVar31 & ~MIR_T_U8) == MIR_T_F);
              uVar29 = local_e48 + 1;
            } while (uVar29 != local_e20);
          }
          else {
            local_e40 = 0;
            uVar49 = 0;
          }
          if (*(char *)(local_d70 + 0x18) != '\0') {
            setup_call_hard_reg_args(gen_ctx,pMVar26,0);
            _MIR_new_var_op(pMVar42,0);
            MIR_new_int_op(pMVar42,uVar49);
            in_stack_fffffffffffff0e8 = (MIR_insn_t)CONCAT44(uStack_a84,local_a88);
            in_stack_fffffffffffff0f8 = pMStack_a78;
            in_stack_fffffffffffff108 = pvStack_a68;
            pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
            gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          }
          if (*(int *)(local_d70 + 8) != 0) {
            paVar50 = &pMVar26[1].ops[0].u;
            uVar49 = 0;
            local_e24 = 0;
            uVar19 = 0;
            local_e48 = local_e48 & 0xffffffff00000000;
            lVar46 = local_d70;
            do {
              uVar18 = local_e24;
              local_cb8._0_8_ = paVar50->i;
              local_cb8._8_8_ = *(long *)((long)paVar50 + 8);
              aStack_ca8.i = *(ulong *)((long)paVar50 + 0x10);
              aStack_ca8.str.s = (char *)(paVar50->mem).disp;
              aStack_ca8._16_8_ = paVar50[1].i;
              aStack_ca8.mem.disp = *(long *)((long)paVar50 + 0x28);
              if (local_cb8[8] != '\x02') {
                __assert_fail("ret_reg_op.mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x1d8,"void machinize_call(gen_ctx_t, MIR_insn_t)");
              }
              iVar48 = *(int *)(*(long *)(lVar46 + 0x10) + uVar49 * 4);
              if (uVar19 < 2 && iVar48 == 8) {
                _MIR_new_var_op(pMVar42,0x11 - (uVar19 == 0));
                MVar32 = MIR_FMOV;
LAB_0015a8f6:
                in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                in_stack_fffffffffffff0f8 = aStack_ca8.i;
                in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                pMVar33 = MIR_new_insn(pMVar42,MVar32);
                uVar19 = uVar19 + 1;
              }
              else {
                if (iVar48 == 9 && uVar19 < 2) {
                  _MIR_new_var_op(pMVar42,0x11 - (uVar19 == 0));
                  MVar32 = MIR_DMOV;
                  goto LAB_0015a8f6;
                }
                if ((uint)local_e48 < 2 && iVar48 == 10) {
                  _MIR_new_var_op(pMVar42,0x21 - ((uint)local_e48 == 0));
                  in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                  in_stack_fffffffffffff0f8 = aStack_ca8.i;
                  in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                  pMVar33 = MIR_new_insn(pMVar42,MIR_LDMOV);
                  local_e48 = CONCAT44(local_e48._4_4_,(uint)local_e48 + 1);
                }
                else {
                  if (1 < local_e24) goto LAB_0015ae66;
                  _MIR_new_var_op(pMVar42,(uint)(local_e24 != 0) * 2);
                  in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                  in_stack_fffffffffffff0f8 = aStack_ca8.i;
                  in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                  pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
                  local_e24 = uVar18 + 1;
                }
              }
              MIR_insert_insn_after(pMVar42,gen_ctx->curr_func_item,pMVar26,pMVar33);
              pvVar10 = pMVar33[1].data;
              pMVar53 = pMVar33[1].insn_link.prev;
              pMVar54 = pMVar33[1].insn_link.next;
              MVar11 = *(MIR_disp_t *)&pMVar33[1].field_0x18;
              MVar12 = *(MIR_disp_t *)&pMVar33[1].field_0x18;
              pvVar13 = pMVar33[1].ops[0].data;
              lVar37 = *(long *)&pMVar33[1].ops[0].field_0x8;
              *(MIR_insn_t *)((long)paVar50 + 0x10) = pMVar33[1].insn_link.next;
              (paVar50->mem).disp = MVar12;
              paVar50[1].i = (int64_t)pvVar13;
              *(long *)((long)paVar50 + 0x28) = lVar37;
              paVar50->i = (int64_t)pvVar10;
              (paVar50->str).s = (char *)pMVar53;
              *(MIR_insn_t *)((long)paVar50 + 0x10) = pMVar54;
              (paVar50->mem).disp = MVar11;
              switch(*(undefined4 *)(*(long *)(lVar46 + 0x10) + uVar49 * 4)) {
              case 0:
                MVar32 = MIR_EXT8;
                break;
              case 1:
                MVar32 = MIR_UEXT8;
                break;
              case 2:
                MVar32 = MIR_EXT16;
                break;
              case 3:
                MVar32 = MIR_UEXT16;
                break;
              case 4:
                MVar32 = MIR_EXT32;
                break;
              case 5:
                MVar32 = MIR_UEXT32;
                break;
              default:
                MVar32 = MIR_INVALID_INSN;
                bVar52 = true;
                goto LAB_0015aa29;
              }
              bVar52 = false;
LAB_0015aa29:
              if (!bVar52) {
                pMVar23 = gen_ctx->curr_func_item;
                in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
                in_stack_fffffffffffff0f8 = aStack_ca8.i;
                in_stack_fffffffffffff108 = aStack_ca8._16_8_;
                pMVar24 = MIR_new_insn(pMVar42,MVar32);
                lVar46 = local_d70;
                MIR_insert_insn_after(pMVar42,pMVar23,pMVar33,pMVar24);
                pMVar33 = (pMVar33->insn_link).next;
              }
              create_new_bb_insns(gen_ctx,pMVar26,(pMVar33->insn_link).next,pMVar26);
              uVar49 = uVar49 + 1;
              paVar50 = (anon_union_32_12_57d33f68_for_u *)((long)paVar50 + 0x30);
            } while (uVar49 < *(uint *)(lVar46 + 8));
          }
          if (local_e40 != 0) {
            uVar49 = local_e40 + 0xf;
            _MIR_new_var_op(pMVar42,4);
            _MIR_new_var_op(pMVar42,4);
            uVar29 = uVar49 & 0xfffffffffffffff0;
            MIR_new_int_op(pMVar42,uVar29);
            pMVar33 = MIR_new_insn(pMVar42,MIR_SUB);
            pMVar53 = local_da0;
            MIR_insert_insn_after(pMVar42,gen_ctx->curr_func_item,local_da0,pMVar33);
            create_new_bb_insns(gen_ctx,pMVar53,(pMVar33->insn_link).next,pMVar26);
            _MIR_new_var_op(pMVar42,4);
            _MIR_new_var_op(pMVar42,4);
            MIR_new_int_op(pMVar42,uVar29);
            in_stack_fffffffffffff0e8 = local_368;
            in_stack_fffffffffffff0f8 = pMStack_358;
            in_stack_fffffffffffff108 = pvStack_348;
            pMVar33 = MIR_new_insn(pMVar42,MIR_ADD);
            MIR_insert_insn_after(pMVar42,gen_ctx->curr_func_item,pMVar26,pMVar33);
            create_new_bb_insns(gen_ctx,pMVar26,(pMVar33->insn_link).next,pMVar26);
            if ((uVar49 & 0xfffffffffffffff0) != 0) {
              gen_ctx->target_ctx->keep_fp_p = '\x01';
            }
          }
          gen_ctx->target_ctx->leaf_p = '\0';
          pMVar42 = local_e38;
        }
        goto LAB_00157f49;
      case MIR_DIV:
      case MIR_DIVS:
      case MIR_UDIV:
      case MIR_UDIVS:
      case MIR_UMULO:
      case MIR_UMULOS:
        _MIR_new_var_op(pMVar42,0);
        pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
        gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
        in_stack_fffffffffffff0e8 = (MIR_insn_t)pMVar26->ops[0].data;
        in_stack_fffffffffffff0f8 = pMVar26->ops[0].u.i;
        in_stack_fffffffffffff108 = *(long *)((long)&pMVar26->ops[0].u + 0x10);
        pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
        gen_add_insn_after(gen_ctx,pMVar26,pMVar33);
        pMVar26[1].insn_link.next = (MIR_insn_t)aStack_ca8.i;
        *(char **)&pMVar26[1].field_0x18 = aStack_ca8.str.s;
        pMVar26[1].ops[0].data = (void *)aStack_ca8._16_8_;
        *(MIR_disp_t *)&pMVar26[1].ops[0].field_0x8 = aStack_ca8.mem.disp;
        pMVar26[1].data = (void *)local_cb8._0_8_;
        pMVar26[1].insn_link.prev = (MIR_insn_t)local_cb8._8_8_;
        pMVar26[1].insn_link.next = (MIR_insn_t)aStack_ca8.i;
        *(char **)&pMVar26[1].field_0x18 = aStack_ca8.str.s;
        *(undefined8 *)((long)&pMVar26->ops[0].u + 0x10) = aStack_ca8._16_8_;
        pMVar26->ops[0].u.mem.disp = aStack_ca8.mem.disp;
        pMVar53 = (MIR_insn_t)local_cb8._0_8_;
        pMVar54 = (MIR_insn_t)local_cb8._8_8_;
        uVar55 = aStack_ca8.i;
        uVar56 = aStack_ca8.str.s;
        goto LAB_0015848a;
      case MIR_MOD:
      case MIR_MODS:
      case MIR_UMOD:
      case MIR_UMODS:
        _MIR_new_var_op(pMVar42,0);
        _MIR_new_var_op(pMVar42,2);
        pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
        gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
        pMVar26[1].insn_link.next = (MIR_insn_t)aStack_ca8.i;
        *(char **)&pMVar26[1].field_0x18 = aStack_ca8.str.s;
        pMVar26[1].ops[0].data = (void *)aStack_ca8._16_8_;
        *(MIR_disp_t *)&pMVar26[1].ops[0].field_0x8 = aStack_ca8.mem.disp;
        pMVar26[1].data = (void *)local_cb8._0_8_;
        pMVar26[1].insn_link.prev = (MIR_insn_t)local_cb8._8_8_;
        pMVar26[1].insn_link.next = (MIR_insn_t)aStack_ca8.i;
        *(char **)&pMVar26[1].field_0x18 = aStack_ca8.str.s;
        in_stack_fffffffffffff0e8 = (MIR_insn_t)pMVar26->ops[0].data;
        in_stack_fffffffffffff0f8 = pMVar26->ops[0].u.i;
        in_stack_fffffffffffff108 = *(long *)((long)&pMVar26->ops[0].u + 0x10);
        pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
        gen_add_insn_after(gen_ctx,pMVar26,pMVar33);
        pMVar26->ops[0].u.i = (int64_t)pMStack_e08;
        pMVar26->ops[0].u.str.s = pcStack_e00;
        *(void **)((long)&pMVar26->ops[0].u + 0x10) = local_df8;
        pMVar26->ops[0].u.mem.disp = (MIR_disp_t)local_df0;
        pMVar53 = local_e18;
        pMVar54 = pMStack_e10;
        uVar55 = pMStack_e08;
        uVar56 = pcStack_e00;
LAB_0015848a:
        pMVar26->ops[0].data = pMVar53;
        *(MIR_insn_t *)&pMVar26->ops[0].field_0x8 = pMVar54;
        pMVar26->ops[0].u.i = uVar55;
        pMVar26->ops[0].u.str.s = (char *)uVar56;
        goto LAB_00157f49;
      case MIR_LSH:
      case MIR_LSHS:
      case MIR_RSH:
      case MIR_RSHS:
      case MIR_URSH:
      case MIR_URSHS:
        _MIR_new_var_op(pMVar42,1);
        in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
        in_stack_fffffffffffff0f8 = aStack_ca8.i;
        in_stack_fffffffffffff108 = aStack_ca8._16_8_;
        pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
        gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
        *(int64_t *)((long)&pMVar26[1].ops[0].u + 0x10) = aStack_ca8.i;
        pMVar26[1].ops[0].u.mem.disp = (MIR_disp_t)aStack_ca8.str.s;
        pMVar26[2].data = (void *)aStack_ca8._16_8_;
        pMVar26[2].insn_link.prev = (MIR_insn_t)aStack_ca8.mem.disp;
        pMVar26[1].ops[0].u.i = local_cb8._0_8_;
        pMVar26[1].ops[0].u.str.s = (char *)local_cb8._8_8_;
        *(int64_t *)((long)&pMVar26[1].ops[0].u + 0x10) = aStack_ca8.i;
        pMVar26[1].ops[0].u.mem.disp = (MIR_disp_t)aStack_ca8.str.s;
        goto LAB_00157f49;
      case MIR_EQ:
      case MIR_EQS:
      case MIR_FEQ:
      case MIR_DEQ:
      case MIR_NE:
      case MIR_NES:
      case MIR_FNE:
      case MIR_DNE:
      case MIR_LT:
      case MIR_LTS:
      case MIR_ULT:
      case MIR_ULTS:
      case MIR_FLT:
      case MIR_DLT:
      case MIR_LE:
      case MIR_LES:
      case MIR_ULE:
      case MIR_ULES:
      case MIR_FLE:
      case MIR_DLE:
      case MIR_GT:
      case MIR_GTS:
      case MIR_UGT:
      case MIR_UGTS:
      case MIR_FGT:
      case MIR_DGT:
      case MIR_GE:
      case MIR_GES:
      case MIR_UGE:
      case MIR_UGES:
      case MIR_FGE:
      case MIR_DGE:
        in_stack_fffffffffffff0e8 = (MIR_insn_t)pMVar26->ops[0].data;
        in_stack_fffffffffffff0f8 = pMVar26->ops[0].u.i;
        in_stack_fffffffffffff108 = *(long *)((long)&pMVar26->ops[0].u + 0x10);
        pMVar33 = MIR_new_insn(pMVar42,MIR_UEXT8);
        gen_add_insn_after(gen_ctx,pMVar26,pMVar33);
        switch(MVar32) {
        case MIR_FLT:
          pvStack_de8 = pMVar26[1].data;
          pMStack_de0 = pMVar26[1].insn_link.prev;
          local_dd8 = pMVar26[1].insn_link.next;
          MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
          pvStack_dc8 = pMVar26[1].ops[0].data;
          pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
          pvVar10 = (void *)pMVar26[1].ops[0].u.i;
          pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
          pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          MVar11 = pMVar26[1].ops[0].u.mem.disp;
          MVar12 = pMVar26[1].ops[0].u.mem.disp;
          pvVar13 = pMVar26[2].data;
          pMVar45 = pMVar26[2].insn_link.prev;
          pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
          pMVar26[1].ops[0].data = pvVar13;
          *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
          pMVar26[1].data = pvVar10;
          pMVar26[1].insn_link.prev = pMVar53;
          pMVar26[1].insn_link.next = pMVar54;
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
          pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
          pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          pMVar26[2].data = pvStack_dc8;
          pMVar26[2].insn_link.prev = pMStack_dc0;
          uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 100;
          break;
        case MIR_DLT:
          pvStack_de8 = pMVar26[1].data;
          pMStack_de0 = pMVar26[1].insn_link.prev;
          local_dd8 = pMVar26[1].insn_link.next;
          MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
          pvStack_dc8 = pMVar26[1].ops[0].data;
          pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
          pvVar10 = (void *)pMVar26[1].ops[0].u.i;
          pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
          pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          MVar11 = pMVar26[1].ops[0].u.mem.disp;
          MVar12 = pMVar26[1].ops[0].u.mem.disp;
          pvVar13 = pMVar26[2].data;
          pMVar45 = pMVar26[2].insn_link.prev;
          pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
          pMVar26[1].ops[0].data = pvVar13;
          *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
          pMVar26[1].data = pvVar10;
          pMVar26[1].insn_link.prev = pMVar53;
          pMVar26[1].insn_link.next = pMVar54;
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
          pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
          pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          pMVar26[2].data = pvStack_dc8;
          pMVar26[2].insn_link.prev = pMStack_dc0;
          uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x65;
          break;
        default:
          goto switchD_00157a05_caseD_58;
        case MIR_FLE:
          pvStack_de8 = pMVar26[1].data;
          pMStack_de0 = pMVar26[1].insn_link.prev;
          local_dd8 = pMVar26[1].insn_link.next;
          MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
          pvStack_dc8 = pMVar26[1].ops[0].data;
          pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
          pvVar10 = (void *)pMVar26[1].ops[0].u.i;
          pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
          pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          MVar11 = pMVar26[1].ops[0].u.mem.disp;
          MVar12 = pMVar26[1].ops[0].u.mem.disp;
          pvVar13 = pMVar26[2].data;
          pMVar45 = pMVar26[2].insn_link.prev;
          pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
          pMVar26[1].ops[0].data = pvVar13;
          *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
          pMVar26[1].data = pvVar10;
          pMVar26[1].insn_link.prev = pMVar53;
          pMVar26[1].insn_link.next = pMVar54;
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
          pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
          pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          pMVar26[2].data = pvStack_dc8;
          pMVar26[2].insn_link.prev = pMStack_dc0;
          uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x6b;
          break;
        case MIR_DLE:
          pvStack_de8 = pMVar26[1].data;
          pMStack_de0 = pMVar26[1].insn_link.prev;
          local_dd8 = pMVar26[1].insn_link.next;
          MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
          pvStack_dc8 = pMVar26[1].ops[0].data;
          pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
          pvVar10 = (void *)pMVar26[1].ops[0].u.i;
          pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
          pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          MVar11 = pMVar26[1].ops[0].u.mem.disp;
          MVar12 = pMVar26[1].ops[0].u.mem.disp;
          pvVar13 = pMVar26[2].data;
          pMVar45 = pMVar26[2].insn_link.prev;
          pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
          pMVar26[1].ops[0].data = pvVar13;
          *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
          pMVar26[1].data = pvVar10;
          pMVar26[1].insn_link.prev = pMVar53;
          pMVar26[1].insn_link.next = pMVar54;
          *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
          pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
          pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
          pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
          pMVar26[2].data = pvStack_dc8;
          pMVar26[2].insn_link.prev = pMStack_dc0;
          uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x6c;
        }
        *(ulong *)&pMVar26->field_0x18 = uVar49;
switchD_00157a05_caseD_58:
        goto LAB_00157f49;
      case MIR_LDLT:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x66;
        break;
      case MIR_LDLE:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x6d;
        break;
      case MIR_FBLT:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x97;
        break;
      case MIR_DBLT:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x98;
        break;
      case MIR_LDBLT:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x99;
        break;
      case MIR_FBLE:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x9e;
        break;
      case MIR_DBLE:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0x9f;
        break;
      case MIR_LDBLE:
        pvStack_de8 = pMVar26[1].data;
        pMStack_de0 = pMVar26[1].insn_link.prev;
        local_dd8 = pMVar26[1].insn_link.next;
        MStack_dd0 = *(MIR_disp_t *)&pMVar26[1].field_0x18;
        pvStack_dc8 = pMVar26[1].ops[0].data;
        pMStack_dc0 = *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8;
        pvVar10 = (void *)pMVar26[1].ops[0].u.i;
        pMVar53 = (MIR_insn_t)pMVar26[1].ops[0].u.str.s;
        pMVar54 = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        MVar11 = pMVar26[1].ops[0].u.mem.disp;
        MVar12 = pMVar26[1].ops[0].u.mem.disp;
        pvVar13 = pMVar26[2].data;
        pMVar45 = pMVar26[2].insn_link.prev;
        pMVar26[1].insn_link.next = *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10);
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar12;
        pMVar26[1].ops[0].data = pvVar13;
        *(MIR_insn_t *)&pMVar26[1].ops[0].field_0x8 = pMVar45;
        pMVar26[1].data = pvVar10;
        pMVar26[1].insn_link.prev = pMVar53;
        pMVar26[1].insn_link.next = pMVar54;
        *(MIR_disp_t *)&pMVar26[1].field_0x18 = MVar11;
        pMVar26[1].ops[0].u.i = (int64_t)pvStack_de8;
        pMVar26[1].ops[0].u.str.s = (char *)pMStack_de0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        *(MIR_insn_t *)((long)&pMVar26[1].ops[0].u + 0x10) = local_dd8;
        pMVar26[1].ops[0].u.mem.disp = MStack_dd0;
        pMVar26[2].data = pvStack_dc8;
        pMVar26[2].insn_link.prev = pMStack_dc0;
        uVar49 = *(ulong *)&pMVar26->field_0x18 & 0xffffffff00000000 | 0xa0;
        break;
      default:
        switch(MVar32) {
        case MIR_RET:
          uVar19 = ((gen_ctx->curr_func_item->u).func)->nres;
          sVar22 = MIR_insn_nops(pMVar42,pMVar26);
          if (sVar22 != uVar19) {
            __assert_fail("curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x3c2,"void target_machinize(gen_ctx_t)");
          }
          pMVar21 = (gen_ctx->curr_func_item->u).func;
          if (pMVar21->nres != 0) {
            pMVar34 = pMVar26->ops;
            uVar49 = 0;
            uVar35 = 0;
            uVar19 = 0;
            uVar18 = 0;
            do {
              pMVar42 = local_e38;
              MVar31 = pMVar21->res_types[uVar49];
              if (uVar19 < 2 && (MVar31 & ~MIR_T_U8) == MIR_T_F) {
                local_e4c = (MVar31 != MIR_T_F) + MIR_FMOV;
                bVar52 = uVar19 == 0;
                uVar19 = uVar19 + 1;
                MVar17 = 0x11 - bVar52;
              }
              else if (uVar35 < 2 && MVar31 == MIR_T_LD) {
                local_e4c = MIR_LDMOV;
                MVar17 = 0x21 - (uVar35 == 0);
                uVar35 = uVar35 + 1;
              }
              else {
                if (1 < uVar18) goto LAB_0015ae66;
                local_e4c = MIR_MOV;
                bVar52 = uVar18 != 0;
                uVar18 = uVar18 + 1;
                MVar17 = (uint)bVar52 * 2;
              }
              _MIR_new_var_op(local_e38,MVar17);
              pvStack_a38 = (void *)aStack_ca8._16_8_;
              pMStack_a30 = (MIR_insn_t)aStack_ca8.mem.disp;
              pMStack_a58 = (MIR_insn_t)local_cb8._0_8_;
              pMStack_a50 = (MIR_insn_t)local_cb8._8_8_;
              local_a48 = (MIR_insn_t)aStack_ca8.i;
              pcStack_a40 = aStack_ca8.str.s;
              in_stack_fffffffffffff0e8 = (MIR_insn_t)local_cb8._0_8_;
              in_stack_fffffffffffff0f8 = aStack_ca8.i;
              in_stack_fffffffffffff108 = aStack_ca8._16_8_;
              pMVar33 = MIR_new_insn(pMVar42,local_e4c);
              gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
              (pMVar34->u).i = (int64_t)local_a48;
              (pMVar34->u).str.s = pcStack_a40;
              *(void **)((long)&pMVar34->u + 0x10) = pvStack_a38;
              (pMVar34->u).mem.disp = (MIR_disp_t)pMStack_a30;
              pMVar34->data = pMStack_a58;
              *(MIR_insn_t *)&pMVar34->field_0x8 = pMStack_a50;
              (pMVar34->u).i = (int64_t)local_a48;
              (pMVar34->u).str.s = pcStack_a40;
              uVar49 = uVar49 + 1;
              pMVar21 = (gen_ctx->curr_func_item->u).func;
              pMVar34 = pMVar34 + 1;
              pMVar42 = local_e38;
            } while (uVar49 < pMVar21->nres);
          }
          break;
        default:
          goto switchD_0015799d_caseD_10;
        case MIR_ALLOCA:
          ptVar6 = gen_ctx->target_ctx;
          ptVar6->alloca_p = '\x01';
          ptVar6->keep_fp_p = '\x01';
          break;
        case MIR_VA_ARG:
        case MIR_VA_BLOCK_ARG:
          pMVar53 = (MIR_insn_t)pMVar26->ops[0].data;
          uVar4 = *(undefined2 *)&pMVar26->ops[0].field_0x8;
          uStack_cf8 = (undefined6)((ulong)pMVar26->ops[0].u.mem.disp >> 0x10);
          pMStack_d18 = *(MIR_insn_t *)&pMVar26->ops[0].field_0xa;
          pMStack_d10 = *(MIR_insn_t *)((long)&pMVar26->ops[0].u.str.len + 2);
          local_d08 = *(MIR_insn_t *)((long)&pMVar26->ops[0].u.str.s + 2);
          uVar55 = *(undefined8 *)((long)&pMVar26->ops[0].u + 0x12);
          uStack_d00 = (undefined6)uVar55;
          uStack_cfa = (undefined2)((ulong)uVar55 >> 0x30);
          pMVar54 = (MIR_insn_t)pMVar26[1].data;
          uVar3 = *(undefined2 *)&pMVar26[1].insn_link.prev;
          uStack_a98 = (undefined6)((ulong)*(undefined8 *)&pMVar26[1].ops[0].field_0x8 >> 0x10);
          local_ab8 = *(MIR_insn_t *)((long)&pMVar26[1].insn_link.prev + 2);
          lStack_ab0 = *(long *)((long)&pMVar26[1].insn_link.next + 2);
          pMStack_aa8 = *(MIR_insn_t *)&pMVar26[1].field_0x1a;
          uVar55 = *(undefined8 *)((long)&pMVar26[1].ops[0].data + 2);
          uStack_aa0 = (undefined6)uVar55;
          uStack_a9a = (undefined2)((ulong)uVar55 >> 0x30);
          local_da0 = (MIR_insn_t)pMVar26[1].ops[0].u.i;
          uVar30 = *(undefined2 *)((long)&pMVar26[1].ops[0].u + 8);
          uStack_ae4 = *(undefined2 *)((long)&pMVar26[1].ops[0].u + 0xe);
          local_ae8 = *(undefined4 *)((long)&pMVar26[1].ops[0].u.mem.nonalias + 2);
          bVar47 = *(byte *)((long)&pMVar26[1].ops[0].u + 0x10);
          local_b48.data = *(void **)((long)&pMVar26[1].ops[0].u + 0x11);
          local_b48._8_7_ = SUB87(*(undefined8 *)((long)&pMVar26[1].ops[0].u.mem.disp + 1),0);
          pMVar45 = pMVar26[2].insn_link.prev;
          local_b48._15_1_ = SUB81(pMVar26[2].data,0);
          local_b48.u.i._0_7_ = (undefined7)((ulong)pMVar26[2].data >> 8);
          local_b48.u.i._7_1_ = SUB81(pMVar45,0);
          local_b48.u._8_7_ = (undefined7)((ulong)pMVar45 >> 8);
          get_builtin(gen_ctx,MVar32,(MIR_item_t_conflict *)local_9f8,
                      (MIR_item_t_conflict *)&local_a28);
          if ((((char)uVar4 != '\x02') || (local_e70._0_1_ = (char)uVar3, (char)local_e70 != '\x02')
              ) || ((char)((MVar32 == MIR_VA_ARG) * '\t' + '\x02') != (char)uVar30)) {
            __assert_fail("res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x3a0,"void target_machinize(gen_ctx_t)");
          }
          MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d60);
          uVar19 = MVar17 + 0x21;
          if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
            gen_ctx->curr_cfg->max_var = uVar19;
          }
          local_e40 = CONCAT62(local_e40._2_6_,uVar4);
          _MIR_new_var_op(local_e38,uVar19);
          pcStack_e00 = (char *)CONCAT26(uStack_d3a,uStack_d40);
          local_df8 = (void *)CONCAT26(uStack_d32,uStack_d38);
          local_df0 = pMStack_d30;
          local_e18 = local_d58;
          pMStack_e10 = pMStack_d50;
          pMStack_e08 = pMStack_d48;
          MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,local_d60);
          pMVar42 = local_e38;
          uVar19 = MVar17 + 0x21;
          if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
            gen_ctx->curr_cfg->max_var = uVar19;
          }
          _MIR_new_var_op(local_e38,uVar19);
          uStack_cc8 = (undefined1)uStack_d38;
          uStack_cc7 = (undefined7)(CONCAT26(uStack_d32,uStack_d38) >> 8);
          pMStack_cc0 = pMStack_d30;
          local_ce8 = local_d58;
          uStack_ce0 = pMStack_d50;
          bStack_cd8 = (byte)pMStack_d48;
          uStack_cd7 = (undefined7)((ulong)pMStack_d48 >> 8);
          uStack_cd0 = (undefined1)uStack_d40;
          uStack_ccf = (undefined7)(CONCAT26(uStack_d3a,uStack_d40) >> 8);
          MIR_new_ref_op(pMVar42,(MIR_item_t_conflict)local_a28.data);
          in_stack_fffffffffffff0e8 = local_e18;
          in_stack_fffffffffffff0f8 = pMStack_e08;
          in_stack_fffffffffffff108 = local_df8;
          local_d98 = MIR_new_insn(pMVar42,MIR_MOV);
          gen_add_insn_before(gen_ctx,pMVar26,local_d98);
          pMVar45 = local_da0;
          if (MVar32 == MIR_VA_ARG) {
            MIR_new_int_op(pMVar42,(ulong)bVar47);
            in_stack_fffffffffffff0f8 = CONCAT71(uStack_cd7,bStack_cd8);
            in_stack_fffffffffffff108 = CONCAT71(uStack_cc7,uStack_cc8);
            in_stack_fffffffffffff0e8 = local_ce8;
            pMVar33 = MIR_new_insn(pMVar42,MIR_MOV);
            bVar47 = bStack_cd8;
            pMVar45 = local_ce8;
            uVar30 = (undefined2)uStack_ce0;
            local_ae8 = uStack_ce0._2_4_;
            uStack_ae4 = uStack_ce0._6_2_;
            local_b48.data = (void *)CONCAT17(uStack_cd0,uStack_cd7);
            local_b48._8_7_ = uStack_ccf;
            local_b48._15_1_ = uStack_cc8;
            local_b48.u.i._0_7_ = uStack_cc7;
            local_b48.u.i._7_1_ = SUB81(pMStack_cc0,0);
            local_b48.u._8_7_ = (undefined7)((ulong)pMStack_cc0 >> 8);
            gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          }
          MIR_new_ref_op(pMVar42,(MIR_item_t_conflict)local_9f8[0]);
          plVar14 = local_b90;
          pMVar42 = local_e38;
          aStack_ca8.str.s = (char *)CONCAT26(uStack_d3a,uStack_d40);
          aStack_ca8._16_8_ = CONCAT26(uStack_d32,uStack_d38);
          aStack_ca8.mem.disp = (MIR_disp_t)pMStack_d30;
          local_cb8._0_8_ = local_d58;
          local_cb8._8_8_ = pMStack_d50;
          aStack_ca8.i = (int64_t)pMStack_d48;
          pvStack_c68 = local_df8;
          pMStack_c60 = local_df0;
          local_c88 = local_e18;
          pMStack_c80 = pMStack_e10;
          pMStack_c78 = pMStack_e08;
          pcStack_c70 = pcStack_e00;
          local_c50 = (undefined2)local_e40;
          uStack_c2e = uStack_cf8;
          uStack_c4e = SUB86(pMStack_d18,0);
          local_c48 = (undefined2)((ulong)pMStack_d18 >> 0x30);
          uStack_c46 = SUB86(pMStack_d10,0);
          uStack_c40 = (undefined2)((ulong)pMStack_d10 >> 0x30);
          uStack_c3e = SUB86(local_d08,0);
          uStack_c38 = (undefined2)((ulong)local_d08 >> 0x30);
          uStack_c36 = uStack_d00;
          uStack_c30 = uStack_cfa;
          local_c20._0_2_ = uVar3;
          *(ulong *)((long)local_b90 + 0x1e) = CONCAT62(uStack_a98,uStack_a9a);
          pMVar15 = pMStack_aa8;
          lVar37 = lStack_ab0;
          lVar46 = CONCAT26(uStack_a9a,uStack_aa0);
          *plVar14 = (long)local_ab8;
          plVar14[1] = lVar37;
          plVar14[2] = (long)pMVar15;
          plVar14[3] = lVar46;
          local_bf0 = (MIR_insn_t)CONCAT26(uStack_ae4,CONCAT42(local_ae8,uVar30));
          pMStack_bd0 = (MIR_insn_t)CONCAT71(local_b48.u._8_7_,local_b48.u.i._7_1_);
          uStack_bd7 = local_b48.u.i._0_7_;
          uStack_be7 = SUB87(local_b48.data,0);
          uStack_be0 = (undefined1)((ulong)local_b48.data >> 0x38);
          uStack_bdf = local_b48._8_7_;
          uStack_bd8 = local_b48._15_1_;
          if (MVar32 == MIR_VA_BLOCK_ARG) {
            pMStack_bc8 = pMVar26[2].insn_link.next;
            uStack_bc0 = *(undefined8 *)&pMVar26[2].field_0x18;
            local_bb8 = pMVar26[2].ops[0].data;
            uStack_bb0 = *(undefined8 *)&pMVar26[2].ops[0].field_0x8;
            iStack_ba8 = pMVar26[2].ops[0].u.i;
            pcStack_ba0 = pMVar26[2].ops[0].u.str.s;
          }
          local_c58 = pMVar53;
          local_c28 = pMVar54;
          local_bf8 = pMVar45;
          local_be8 = bVar47;
          pMVar33 = MIR_new_insn_arr(local_e38,MIR_CALL,(ulong)(MVar32 != MIR_VA_ARG) + 5,
                                     (MIR_op_t *)local_cb8);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          gen_delete_insn(gen_ctx,pMVar26);
          break;
        case MIR_VA_START:
          MVar17 = _MIR_new_temp_reg(gen_ctx->ctx,MIR_T_I64,(gen_ctx->curr_func_item->u).func);
          uVar19 = MVar17 + 0x21;
          if ((uVar19 != 0xffffffff) && (gen_ctx->curr_cfg->max_var < uVar19)) {
            gen_ctx->curr_cfg->max_var = uVar19;
          }
          _MIR_new_var_op(pMVar42,uVar19);
          if ((local_d60->vararg_p == '\0') || (pMVar26->ops[0].field_0x8 != '\x02')) {
            __assert_fail("func->vararg_p && va_op.mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x361,"void target_machinize(gen_ctx_t)");
          }
          MVar17 = pMVar26->ops[0].u.reg;
          if (local_d60->nargs == 0) {
            iVar48 = 8;
            i_00 = 0x30;
            i = 0;
          }
          else {
            pVVar7 = local_d60->vars;
            if ((pVVar7 == (VARR_MIR_var_t *)0x0) || (pVVar7->varr == (MIR_var_t *)0x0)) {
LAB_0015adf6:
              target_machinize_cold_2();
LAB_0015adfb:
              __assert_fail("blk_size > 8 && blk_size <= 16",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x2ea,"void target_machinize(gen_ctx_t)");
            }
            psVar27 = &pVVar7->varr->size;
            iVar38 = 0x30;
            uVar49 = 0;
            iVar48 = 0;
            iVar43 = 0;
            do {
              if (pVVar7->els_num <= uVar49) goto LAB_0015adf6;
              MVar31 = ((MIR_var_t *)(psVar27 + -2))->type;
              iVar44 = iVar43;
              if ((MVar31 & ~MIR_T_U8) == MIR_T_F) {
                iVar38 = iVar38 + 0x10;
                iVar16 = iVar48 + 8;
                if (iVar43 < 0xb0) {
                  iVar16 = iVar48;
                }
              }
              else if (MVar31 == MIR_T_LD) {
                iVar16 = iVar48 + 0x10;
              }
              else if (MVar31 - MIR_T_RBLK < 0xfffffffb) {
                iVar44 = iVar43 + 8;
                iVar16 = iVar48 + 8;
                if (iVar43 < 0x28) {
                  iVar16 = iVar48;
                }
              }
              else {
                iVar16 = iVar48 + (int)*psVar27;
              }
              iVar48 = iVar16;
              uVar49 = uVar49 + 1;
              psVar27 = psVar27 + 3;
              iVar43 = iVar44;
            } while (local_d60->nargs != (uint32_t)uVar49);
            i = (int64_t)iVar44;
            i_00 = (int64_t)iVar38;
            iVar48 = iVar48 + 8;
          }
          _MIR_new_var_mem_op(local_758,pMVar42,MIR_T_U32,0,MVar17,0xffffffff,'\x01');
          MIR_new_int_op(pMVar42,i);
          pMVar33 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          local_d98 = (pMVar26->insn_link).prev;
          _MIR_new_var_mem_op(local_7b8,pMVar42,MIR_T_U32,4,MVar17,0xffffffff,'\x01');
          MIR_new_int_op(pMVar42,i_00);
          pMVar33 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          _MIR_new_var_op(pMVar42,5);
          MIR_new_int_op(pMVar42,(long)iVar48 + (long)gen_ctx->target_ctx->start_sp_from_bp_offset);
          pMVar33 = MIR_new_insn(pMVar42,MIR_ADD);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          _MIR_new_var_mem_op(local_878,pMVar42,MIR_T_I64,8,MVar17,0xffffffff,'\x01');
          pMVar33 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          _MIR_new_var_op(pMVar42,5);
          MIR_new_int_op(pMVar42,-0xb0);
          pMVar33 = MIR_new_insn(pMVar42,MIR_ADD);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          _MIR_new_var_mem_op(local_908,pMVar42,MIR_T_I64,0x10,MVar17,0xffffffff,'\x01');
          in_stack_fffffffffffff0e8 = (MIR_insn_t)local_908[0].data;
          in_stack_fffffffffffff0f8 = local_908[0].u.i;
          in_stack_fffffffffffff108 = local_908[0].u._16_8_;
          pMVar33 = MIR_new_insn(gen_ctx->ctx,MIR_MOV);
          gen_add_insn_before(gen_ctx,pMVar26,pMVar33);
          goto LAB_00158376;
        case MIR_VA_END:
          gen_delete_insn(gen_ctx,pMVar26);
        }
        goto LAB_00157f49;
      }
      *(ulong *)&pMVar26->field_0x18 = uVar49;
LAB_00157f49:
      pMVar26 = local_d98;
    } while (local_d98 != (MIR_insn_t_conflict)0x0);
  }
  return;
LAB_0015ae66:
  p_Var25 = MIR_get_error_func(pMVar42);
  pcVar40 = "x86-64 can not handle this combination of return values";
  MVar41 = MIR_ret_error;
LAB_0015ae7d:
  (*p_Var25)(MVar41,pcVar40);
LAB_0015ae81:
  __assert_fail("res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x349,"void target_machinize(gen_ctx_t)");
}

Assistant:

static void target_machinize (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func;
  MIR_type_t type, mem_type, res_type;
  MIR_insn_code_t code, new_insn_code;
  MIR_insn_t insn, next_insn, new_insn;
  MIR_reg_t ret_reg, arg_reg;
  MIR_op_t ret_reg_op, arg_reg_op, mem_op, temp_op;
  size_t i, blk_size, int_arg_num = 0, fp_arg_num = 0, mem_size = spill_space_size;

  assert (curr_func_item->item_type == MIR_func_item);
  func = curr_func_item->u.func;
  block_arg_func_p = FALSE;
  start_sp_from_bp_offset = 8;
  keep_fp_p = func->vararg_p;
  for (i = 0; i < func->nargs; i++) {
    /* Argument extensions is already done in simplify */
    /* Prologue: generate arg_var = hard_reg|stack mem|stack addr ... */
    type = VARR_GET (MIR_var_t, func->vars, i).type;
    blk_size = MIR_blk_type_p (type) ? (VARR_GET (MIR_var_t, func->vars, i).size + 7) / 8 * 8 : 0;
#ifndef _WIN32
    if ((type == MIR_T_BLK + 1 && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
         && (blk_size <= 8 || get_int_arg_reg (int_arg_num + 1) != MIR_NON_VAR))
        || (type == MIR_T_BLK + 2 && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR
            && (blk_size <= 8 || get_fp_arg_reg (fp_arg_num + 1) != MIR_NON_VAR))) {
      /* all is passed in gprs or fprs */
      MIR_type_t mov_type = type == MIR_T_BLK + 1 ? MIR_T_I64 : MIR_T_D;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg2, reg1 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code1);

      assert (blk_size <= 16);
      if (blk_size > 8) {
        reg2 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code2);
        new_insn = MIR_new_insn (ctx, mov_code1,
                                 _MIR_new_var_mem_op (ctx, mov_type, 8, i + MAX_HARD_REG + 1,
                                                      MIR_NON_VAR, 1),
                                 _MIR_new_var_op (ctx, reg2));
        prepend_insn (gen_ctx, new_insn);
      }
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    } else if ((type == MIR_T_BLK + 3 || type == MIR_T_BLK + 4)
               && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
               && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR) {
      /* gpr and then fpr or fpr and then gpr */
      MIR_type_t mov_type1 = type == MIR_T_BLK + 3 ? MIR_T_I64 : MIR_T_D;
      MIR_type_t mov_type2 = type == MIR_T_BLK + 3 ? MIR_T_D : MIR_T_I64;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg1 = get_arg_reg (mov_type1, &int_arg_num, &fp_arg_num, &mov_code1);
      MIR_reg_t reg2 = get_arg_reg (mov_type2, &int_arg_num, &fp_arg_num, &mov_code2);

      assert (blk_size > 8 && blk_size <= 16);
      new_insn = MIR_new_insn (ctx, mov_code2,
                               _MIR_new_var_mem_op (ctx, mov_type2, 8, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg2));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type1, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    }
#endif
    int blk_p = MIR_blk_type_p (type);
#ifdef _WIN32
    if (blk_p && blk_size > 8) { /* just address */
      blk_p = FALSE;
      type = MIR_T_I64;
    }
#endif
    if (blk_p) {
      keep_fp_p = block_arg_func_p = TRUE;
#ifdef _WIN32
      assert (blk_size <= 8);
      if ((arg_reg = get_arg_reg (MIR_T_I64, &int_arg_num, &fp_arg_num, &new_insn_code))
          == MIR_NON_VAR) {
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG),
                          MIR_new_int_op (ctx, mem_size + 8 /* ret */
                                                 + start_sp_from_bp_offset));
        mem_size += 8;
      } else { /* put reg into spill space and use its address: prepend in reverse order:  */
        int disp = (int) (mem_size + 8 /* ret */ + start_sp_from_bp_offset - spill_space_size
                          + 8 * get_int_arg_reg_num (arg_reg));
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG), MIR_new_int_op (ctx, disp));
        prepend_insn (gen_ctx, new_insn);
        arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
        mem_op = _MIR_new_var_mem_op (ctx, MIR_T_I64, disp, FP_HARD_REG, MIR_NON_VAR, 1);
        new_insn = MIR_new_insn (ctx, MIR_MOV, mem_op, arg_reg_op);
      }
#else
      new_insn = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size + 8 /* ret addr */
                                                      + start_sp_from_bp_offset));
      mem_size += blk_size;
#endif
      prepend_insn (gen_ctx, new_insn);
    } else if ((arg_reg = get_arg_reg (type, &int_arg_num, &fp_arg_num, &new_insn_code))
               != MIR_NON_VAR) {
      arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
      new_insn
        = MIR_new_insn (ctx, new_insn_code,
                        _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), arg_reg_op);
      prepend_insn (gen_ctx, new_insn);
    } else {
      /* arg is on the stack */
      keep_fp_p = block_arg_func_p = TRUE;
      mem_type = type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64;
      new_insn_code = (type == MIR_T_F    ? MIR_FMOV
                       : type == MIR_T_D  ? MIR_DMOV
                       : type == MIR_T_LD ? MIR_LDMOV
                                          : MIR_MOV);
      mem_op = _MIR_new_var_mem_op (ctx, mem_type,
                                    mem_size + 8 /* ret */
                                      + start_sp_from_bp_offset,
                                    FP_HARD_REG, MIR_NON_VAR, 1);
      new_insn = MIR_new_insn (ctx, new_insn_code,
                               _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), mem_op);
      prepend_insn (gen_ctx, new_insn);
      mem_size += type == MIR_T_LD ? 16 : 8;
    }
  }
  alloca_p = FALSE;
  leaf_p = TRUE;
  for (insn = DLIST_HEAD (MIR_insn_t, func->insns); insn != NULL; insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, insn);
    code = insn->code;
    switch (code) {
    case MIR_UI2F:
    case MIR_UI2D:
    case MIR_UI2LD:
    case MIR_LD2I: {
      /* Use a builtin func call: mov freg, func ref; call proto, freg, res_reg, op_reg */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t freg_op, res_reg_op = insn->ops[0], op_reg_op = insn->ops[1], ops[4];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR);
      freg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, freg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = freg_op;
      ops[2] = res_reg_op;
      ops[3] = op_reg_op;
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, 4, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_START: {
      MIR_op_t treg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      MIR_op_t va_op = insn->ops[0];
      MIR_reg_t va_reg;
#ifndef _WIN32
      int gp_offset = 0, fp_offset = 48, mem_offset = 0;
      MIR_var_t var;

      assert (func->vararg_p && va_op.mode == MIR_OP_VAR);
      for (uint32_t narg = 0; narg < func->nargs; narg++) {
        var = VARR_GET (MIR_var_t, func->vars, narg);
        if (var.type == MIR_T_F || var.type == MIR_T_D) {
          fp_offset += 16;
          if (gp_offset >= 176) mem_offset += 8;
        } else if (var.type == MIR_T_LD) {
          mem_offset += 16;
        } else if (MIR_blk_type_p (var.type)) {
          mem_offset += var.size;
        } else { /* including RBLK */
          gp_offset += 8;
          if (gp_offset >= 48) mem_offset += 8;
        }
      }
      va_reg = va_op.u.var;
      /* Insns can be not simplified as soon as they match a machine insn.  */
      /* mem32[va_reg] = gp_offset; mem32[va_reg] = fp_offset */
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 0, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, gp_offset));
      next_insn = DLIST_PREV (MIR_insn_t, insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 4, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, fp_offset));
      /* overflow_arg_area_reg: treg = start sp + 8 + mem_offset; mem64[va_reg + 8] = treg */
      new_insn
        = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                        MIR_new_int_op (ctx, 8 /*ret*/ + mem_offset + start_sp_from_bp_offset));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 8, va_reg, MIR_NON_VAR, 1), treg_op);
      /* reg_save_area: treg = start sp - reg_save_area_size; mem64[va_reg + 16] = treg */
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, -reg_save_area_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 16, va_reg, MIR_NON_VAR, 1), treg_op);
#else
      /* init va_list */
      mem_size = 8 /*ret*/ + start_sp_from_bp_offset + func->nargs * 8;
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      va_reg = va_op.u.var;
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 0, va_reg, MIR_NON_VAR, 1), treg_op);
#endif
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_END: /* do nothing */ gen_delete_insn (gen_ctx, insn); break;
    case MIR_VA_ARG:
    case MIR_VA_BLOCK_ARG: {
      /* Use a builtin func call:
         mov func_reg, func ref; [mov reg3, type;] call proto, func_reg, res_reg, va_reg,
         reg3 */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t ops[6], func_reg_op, reg_op3;
      MIR_op_t res_reg_op = insn->ops[0], va_reg_op = insn->ops[1], op3 = insn->ops[2];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR
              && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR));
      func_reg_op = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      reg_op3 = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, func_reg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      if (code == MIR_VA_ARG) {
        new_insn = MIR_new_insn (ctx, MIR_MOV, reg_op3,
                                 MIR_new_int_op (ctx, (int64_t) op3.u.var_mem.type));
        op3 = reg_op3;
        gen_add_insn_before (gen_ctx, insn, new_insn);
      }
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = func_reg_op;
      ops[2] = res_reg_op;
      ops[3] = va_reg_op;
      ops[4] = op3;
      if (code == MIR_VA_BLOCK_ARG) ops[5] = insn->ops[3];
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, code == MIR_VA_ARG ? 5 : 6, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_ALLOCA: keep_fp_p = alloca_p = TRUE; break;
    case MIR_RET: {
      /* In simplify we already transformed code for one return insn
         and added extension in return (if any).  */
      uint32_t n_iregs = 0, n_xregs = 0, n_fregs = 0;

#ifdef _WIN32
      if (curr_func_item->u.func->nres > 1)
        (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                     "Windows x86-64 doesn't support multiple return values");
#endif
      assert (curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn));
      for (size_t nres = 0; nres < curr_func_item->u.func->nres; nres++) {
        res_type = curr_func_item->u.func->res_types[nres];
        if ((res_type == MIR_T_F || res_type == MIR_T_D) && n_xregs < 2) {
          new_insn_code = res_type == MIR_T_F ? MIR_FMOV : MIR_DMOV;
          ret_reg = n_xregs++ == 0 ? XMM0_HARD_REG : XMM1_HARD_REG;
        } else if (res_type == MIR_T_LD && n_fregs < 2) {  // ???
          new_insn_code = MIR_LDMOV;
          ret_reg = n_fregs == 0 ? ST0_HARD_REG : ST1_HARD_REG;
          n_fregs++;
        } else if (n_iregs < 2) {
          new_insn_code = MIR_MOV;
          ret_reg = n_iregs++ == 0 ? AX_HARD_REG : DX_HARD_REG;
        } else {
          (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                       "x86-64 can not handle this combination of return values");
        }
        ret_reg_op = _MIR_new_var_op (ctx, ret_reg);
        new_insn = MIR_new_insn (ctx, new_insn_code, ret_reg_op, insn->ops[nres]);
        gen_add_insn_before (gen_ctx, insn, new_insn);
        insn->ops[nres] = ret_reg_op;
      }
      break;
    }
    case MIR_LSH:
    case MIR_RSH:
    case MIR_URSH:
    case MIR_LSHS:
    case MIR_RSHS:
    case MIR_URSHS: {
      /* We can access only cl as shift register: */
      MIR_op_t creg_op = _MIR_new_var_op (ctx, CX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, creg_op, insn->ops[2]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[2] = creg_op;
      break;
    }
    case MIR_UMULO:
    case MIR_UMULOS: {
      /* We can use only ax as zero and the 1st operand: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_DIV:
    case MIR_UDIV:
    case MIR_DIVS:
    case MIR_UDIVS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_MOD:
    case MIR_UMOD:
    case MIR_MODS:
    case MIR_UMODS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);
      MIR_op_t dreg_op = _MIR_new_var_op (ctx, DX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[1] = areg_op;
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], dreg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = dreg_op;
      break;
    }
    case MIR_EQ:
    case MIR_NE:
    case MIR_LT:
    case MIR_ULT:
    case MIR_LE:
    case MIR_ULE:
    case MIR_GT:
    case MIR_UGT:
    case MIR_GE:
    case MIR_UGE:
    case MIR_EQS:
    case MIR_NES:
    case MIR_LTS:
    case MIR_ULTS:
    case MIR_LES:
    case MIR_ULES:
    case MIR_GTS:
    case MIR_UGTS:
    case MIR_GES:
    case MIR_UGES:
    case MIR_FEQ:
    case MIR_FNE:
    case MIR_FLT:
    case MIR_FLE:
    case MIR_FGT:
    case MIR_FGE:
    case MIR_DEQ:
    case MIR_DNE:
    case MIR_DLT:
    case MIR_DLE:
    case MIR_DGT:
    case MIR_DGE: {
      new_insn = MIR_new_insn (ctx, MIR_UEXT8, insn->ops[0], insn->ops[0]);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      /* Following conditional branches are changed to correctly process unordered numbers: */
      switch (code) {
      case MIR_FLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGT;
        break;
      case MIR_FLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGE;
        break;
      case MIR_DLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGT;
        break;
      case MIR_DLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGE;
        break;
      default: break; /* do nothing */
      }
      break;
    }
    /* Following conditional branches are changed to correctly process unordered numbers: */
    case MIR_LDLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGT;
      break;
    case MIR_LDLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGE;
      break;
    case MIR_FBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGT;
      break;
    case MIR_FBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGE;
      break;
    case MIR_DBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGT;
      break;
    case MIR_DBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGE;
      break;
    case MIR_LDBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGT;
      break;
    case MIR_LDBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGE;
      break;
    default:
      if (MIR_call_code_p (code)) {
        machinize_call (gen_ctx, insn);
        leaf_p = FALSE;
      }
      break;
    }
  }
}